

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::forward
          (DeconvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  int iVar9;
  int *piVar10;
  uint *puVar11;
  size_t sVar12;
  void *pvVar13;
  void *pvVar14;
  undefined4 *puVar15;
  float *pfVar16;
  Layer *pLVar17;
  bool bVar18;
  byte bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  float afVar35 [16];
  float afVar36 [16];
  float afVar37 [16];
  float afVar38 [16];
  float afVar39 [16];
  float afVar40 [16];
  float afVar41 [16];
  float afVar42 [16];
  float afVar43 [16];
  float afVar44 [16];
  float afVar45 [16];
  float afVar46 [16];
  float afVar47 [16];
  float afVar48 [16];
  float afVar49 [16];
  float afVar50 [16];
  float afVar51 [16];
  Mat *pMVar52;
  Option OVar53;
  undefined1 auVar54 [36];
  int iVar55;
  uint uVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  ulong uVar68;
  int x;
  int iVar69;
  ulong uVar70;
  int iVar71;
  void *pvVar72;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 (*pauVar73) [64];
  undefined1 (*pauVar74) [32];
  undefined1 (*pauVar75) [16];
  int iVar76;
  long lVar77;
  size_t sVar78;
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  int iVar82;
  ulong uVar83;
  void *pvVar84;
  uint _elempack;
  undefined1 auVar107 [16];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  float __x;
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  v4sf one;
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 in_ZMM29 [64];
  undefined1 auVar183 [64];
  void *local_298;
  ulong local_278;
  float *local_270;
  Mat local_218;
  long local_1d0;
  ulong local_1c8;
  Mat *local_1c0;
  Option opt_p;
  Mat local_168;
  long local_118;
  void *local_110;
  Mat m_1;
  Mat m;
  Option opt_g;
  undefined8 uVar7;
  undefined1 auVar123 [32];
  undefined1 auVar100 [16];
  undefined1 auVar106 [16];
  
  auVar85 = in_ZMM29._0_16_;
  iVar64 = bottom_blob->w;
  iVar69 = bottom_blob->h;
  uVar68 = bottom_blob->elemsize;
  iVar57 = bottom_blob->elempack;
  if (opt->use_packing_layout == true) {
    uVar79 = (this->super_DeconvolutionDepthWise).num_output;
    if ((uVar79 & 0xf) == 0) {
      uVar79 = 0x10;
    }
    else if ((uVar79 & 7) == 0) {
      uVar79 = 8;
    }
    else {
      uVar79 = (uint)((uVar79 & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar79 = 1;
  }
  iVar71 = (this->super_DeconvolutionDepthWise).kernel_w;
  iVar76 = (this->super_DeconvolutionDepthWise).stride_w;
  iVar65 = ((this->super_DeconvolutionDepthWise).kernel_h + -1) *
           (this->super_DeconvolutionDepthWise).dilation_h;
  iVar82 = (this->super_DeconvolutionDepthWise).dilation_w;
  iVar55 = (this->super_DeconvolutionDepthWise).stride_h;
  iVar67 = (this->super_DeconvolutionDepthWise).output_pad_right;
  iVar61 = (this->super_DeconvolutionDepthWise).output_pad_bottom;
  uVar56 = bottom_blob->c;
  uVar83 = (ulong)uVar56;
  local_218.cstep = 0;
  local_218.data = (void *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize = 0;
  local_218.elempack = 0;
  local_218.allocator = (Allocator *)0x0;
  local_218.dims = 0;
  local_218.w = 0;
  local_218.h = 0;
  local_218.d = 0;
  local_218.c = 0;
  auVar86._0_4_ = (this->super_DeconvolutionDepthWise).pad_left;
  auVar86._4_4_ = (this->super_DeconvolutionDepthWise).pad_right;
  auVar86._8_4_ = (this->super_DeconvolutionDepthWise).pad_top;
  auVar86._12_4_ = (this->super_DeconvolutionDepthWise).pad_bottom;
  uVar80 = vpcmpd_avx512vl((undefined1  [16])0x0,auVar86,1);
  lVar77 = 0x10;
  if (((uVar80 & 0xf) == 0) &&
     ((((this->super_DeconvolutionDepthWise).output_w < 1 ||
       ((this->super_DeconvolutionDepthWise).output_h < 1)) && (lVar77 = 8, &local_218 != top_blob))
     )) {
    piVar10 = top_blob->refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    local_218.data = top_blob->data;
    local_218.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_218.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_218.elemsize = top_blob->elemsize;
    local_218.elempack = top_blob->elempack;
    local_218.allocator = top_blob->allocator;
    uVar4 = top_blob->dims;
    uVar5 = top_blob->w;
    uVar6 = top_blob->h;
    uVar8 = top_blob->d;
    uVar7 = CONCAT44(uVar8,uVar6);
    local_218.c = top_blob->c;
    local_218.cstep = top_blob->cstep;
    local_218.dims = uVar4;
    local_218.w = uVar5;
    local_218._48_8_ = uVar7;
  }
  iVar82 = (iVar71 + -1) * iVar82;
  iVar71 = iVar67 + (iVar64 + -1) * iVar76 + iVar82 + 1;
  iVar76 = iVar61 + (iVar69 + -1) * iVar55 + iVar65 + 1;
  sVar78 = (uVar68 / (ulong)(long)iVar57) * (ulong)uVar79;
  local_1c0 = top_blob;
  Mat::create(&local_218,iVar71,iVar76,(this->super_DeconvolutionDepthWise).num_output / (int)uVar79
              ,sVar78,uVar79,*(Allocator **)(&opt->lightmode + lVar77));
  pvVar13 = local_218.data;
  afVar51 = _ps512_cephes_log_p8;
  afVar50 = _ps512_cephes_log_p7;
  afVar49 = _ps512_cephes_log_p6;
  afVar48 = _ps512_cephes_log_p5;
  afVar47 = _ps512_cephes_log_p4;
  afVar46 = _ps512_cephes_log_p3;
  afVar45 = _ps512_cephes_log_p2;
  afVar44 = ::_ps512_cephes_exp_p5;
  afVar43 = ::_ps512_cephes_exp_p4;
  afVar42 = ::_ps512_cephes_exp_p3;
  afVar41 = ::_ps512_cephes_exp_p2;
  afVar40 = ::_ps512_cephes_exp_p1;
  afVar39 = ::_ps512_cephes_exp_p0;
  afVar38 = ::_ps512_cephes_LOG2EF;
  afVar37 = ::_ps512_exp_lo;
  afVar36 = ::_ps512_exp_hi;
  afVar35 = ::_ps512_1;
  if ((local_218.data != (void *)0x0) && ((long)local_218.c * local_218.cstep != 0)) {
    iVar55 = (this->super_DeconvolutionDepthWise).num_output;
    iVar67 = (this->super_DeconvolutionDepthWise).group;
    if (iVar67 == iVar55 && iVar57 * uVar56 == iVar67) {
      iVar55 = (this->super_DeconvolutionDepthWise).kernel_h *
               (this->super_DeconvolutionDepthWise).kernel_w;
      if (iVar57 == 1) {
        if (iVar71 < 1) {
          iVar71 = 0;
        }
        if (iVar76 < 1) {
          iVar76 = 0;
        }
        local_1c8 = 0;
        if (0 < (int)uVar56) {
          local_1c8 = uVar83;
        }
        local_1d0 = local_218.cstep * local_218.elemsize;
        local_298 = (this->weight_data_tm).data;
        iVar57 = bottom_blob->w;
        local_110 = bottom_blob->data;
        sVar78 = bottom_blob->elemsize;
        local_118 = bottom_blob->cstep * sVar78;
        for (uVar68 = 0; pvVar14 = local_110, uVar68 != local_1c8; uVar68 = uVar68 + 1) {
          local_270 = (float *)(local_1d0 * uVar68 + (long)pvVar13);
          lVar77 = local_118 * uVar68;
          for (iVar67 = 0; iVar67 != iVar76; iVar67 = iVar67 + 1) {
            uVar79 = (this->super_DeconvolutionDepthWise).kernel_h;
            iVar61 = (this->super_DeconvolutionDepthWise).bias_term;
            pvVar72 = (this->super_DeconvolutionDepthWise).bias_data.data;
            iVar2 = (this->super_DeconvolutionDepthWise).activation_type;
            pfVar16 = (float *)(this->super_DeconvolutionDepthWise).activation_params.data;
            uVar80 = (ulong)uVar79;
            if ((int)uVar79 < 1) {
              uVar80 = 0;
            }
            iVar66 = -iVar82;
            for (iVar63 = 0; iVar63 != iVar71; iVar63 = iVar63 + 1) {
              if (iVar61 == 0) {
                auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar149 = ZEXT464(*(uint *)((long)pvVar72 + uVar68 * 4));
              }
              iVar9 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar79 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar83 = 0;
              if (0 < (int)uVar79) {
                uVar83 = (ulong)uVar79;
              }
              iVar58 = (this->super_DeconvolutionDepthWise).stride_w;
              pvVar84 = local_298;
              for (uVar81 = 0; uVar81 != uVar80; uVar81 = uVar81 + 1) {
                iVar59 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar81 +
                         (iVar67 - iVar65);
                if ((-1 < iVar59) &&
                   (iVar60 = iVar59 / iVar9, iVar60 < iVar69 && iVar59 % iVar9 == 0)) {
                  iVar59 = iVar66;
                  for (uVar70 = 0; uVar83 != uVar70; uVar70 = uVar70 + 1) {
                    if ((-1 < iVar59) &&
                       (iVar62 = iVar59 / iVar58, iVar62 < iVar64 && iVar59 % iVar58 == 0)) {
                      auVar85 = vfmadd231ss_fma(auVar149._0_16_,
                                                ZEXT416(*(uint *)((long)pvVar84 + uVar70 * 4)),
                                                ZEXT416(*(uint *)((long)pvVar14 +
                                                                 (long)iVar62 * 4 +
                                                                 (long)iVar60 *
                                                                 (long)iVar57 * sVar78 + lVar77)));
                      auVar149 = ZEXT1664(auVar85);
                    }
                    iVar59 = iVar59 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar84 = (void *)((long)pvVar84 + (long)(int)uVar79 * 4);
              }
              auVar85 = auVar149._0_16_;
              __x = auVar149._0_4_;
              fVar146 = __x;
              switch(iVar2) {
              case 1:
                auVar85 = vmaxss_avx(auVar85,ZEXT416(0));
                fVar146 = auVar85._0_4_;
                break;
              case 2:
                uVar20 = vcmpss_avx512f(auVar85,ZEXT416(0),0xe);
                bVar18 = (bool)((byte)uVar20 & 1);
                fVar146 = (float)((uint)bVar18 * 0x3f800000 + (uint)!bVar18 * (int)*pfVar16) * __x;
                break;
              case 3:
                auVar85 = vmaxss_avx(auVar85,ZEXT416((uint)*pfVar16));
                fVar146 = auVar85._0_4_;
                if (pfVar16[1] < auVar85._0_4_) {
                  fVar146 = pfVar16[1];
                }
                break;
              case 4:
                auVar85 = vminss_avx(auVar85,SUB6416(ZEXT464(0x42b0c0a5),0));
                auVar88._8_4_ = 0x80000000;
                auVar88._0_8_ = 0x8000000080000000;
                auVar88._12_4_ = 0x80000000;
                auVar86 = vxorps_avx512vl(auVar85,auVar88);
                uVar20 = vcmpss_avx512f(auVar85,ZEXT416(0xc2b0c0a5),1);
                bVar18 = (bool)((byte)uVar20 & 1);
                fVar146 = expf((float)((uint)bVar18 * 0x42b0c0a5 + (uint)!bVar18 * auVar86._0_4_));
                fVar146 = 1.0 / (fVar146 + 1.0);
                break;
              case 5:
                fVar146 = expf(__x);
                fVar146 = logf(fVar146 + 1.0);
                fVar146 = tanhf(fVar146);
                fVar146 = fVar146 * __x;
                break;
              case 6:
                fVar3 = *pfVar16;
                auVar87._8_4_ = 0x80000000;
                auVar87._0_8_ = 0x8000000080000000;
                auVar87._12_4_ = 0x80000000;
                auVar86 = vxorps_avx512vl(ZEXT416((uint)pfVar16[1]),auVar87);
                fVar152 = auVar86._0_4_ / fVar3;
                fVar146 = 0.0;
                if ((fVar152 <= __x) && (fVar146 = __x, __x <= fVar152 + 1.0 / fVar3)) {
                  auVar85 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar85,ZEXT416((uint)pfVar16[1]));
                  fVar146 = auVar85._0_4_ * __x;
                }
              }
              *local_270 = fVar146;
              local_270 = local_270 + 1;
              iVar66 = iVar66 + 1;
            }
          }
          local_298 = (void *)((long)local_298 + (long)iVar55 * 4);
        }
      }
      else if (iVar57 == 0x10) {
        auVar149 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar131 = vxorps_avx512dq(auVar149,(undefined1  [64])_ps512_cephes_log_q2);
        auVar132 = vxorps_avx512dq(auVar149,(undefined1  [64])_ps512_cephes_log_q1);
        auVar133 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        if (iVar71 < 1) {
          iVar71 = 0;
        }
        auVar134 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar149);
        if (iVar76 < 1) {
          iVar76 = 0;
        }
        if ((int)uVar56 < 1) {
          uVar83 = 0;
        }
        auVar85 = vxorps_avx512vl(auVar85,auVar85);
        auVar183 = ZEXT1664(auVar85);
        auVar135 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar136 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
        iVar57 = 0;
        for (uVar68 = 0; uVar68 != uVar83; uVar68 = uVar68 + 1) {
          pauVar73 = (undefined1 (*) [64])
                     (local_218.cstep * uVar68 * local_218.elemsize + (long)local_218.data);
          iVar67 = bottom_blob->w;
          sVar78 = bottom_blob->cstep;
          sVar12 = bottom_blob->elemsize;
          pvVar13 = bottom_blob->data;
          pvVar14 = (this->weight_data_tm).data;
          for (iVar61 = 0; iVar61 != iVar76; iVar61 = iVar61 + 1) {
            iVar2 = -iVar82;
            for (iVar66 = 0; iVar66 != iVar71; iVar66 = iVar66 + 1) {
              if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                auVar137 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar137 = *(undefined1 (*) [64])
                            ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                            uVar68 * 0x40);
              }
              iVar63 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar79 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar56 = (this->super_DeconvolutionDepthWise).kernel_h;
              uVar80 = 0;
              if (0 < (int)uVar79) {
                uVar80 = (ulong)uVar79;
              }
              iVar9 = (this->super_DeconvolutionDepthWise).stride_w;
              if ((int)uVar56 < 1) {
                uVar56 = 0;
              }
              pvVar72 = (void *)((long)iVar57 * 4 + (long)pvVar14);
              for (uVar81 = 0; uVar81 != uVar56; uVar81 = uVar81 + 1) {
                iVar58 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar81 +
                         (iVar61 - iVar65);
                if ((-1 < iVar58) &&
                   (iVar59 = iVar58 / iVar63, iVar59 < iVar69 && iVar58 % iVar63 == 0)) {
                  iVar58 = iVar2;
                  for (lVar77 = 0; uVar80 * 0x40 != lVar77; lVar77 = lVar77 + 0x40) {
                    if ((-1 < iVar58) &&
                       (iVar60 = iVar58 / iVar9, iVar60 < iVar64 && iVar58 % iVar9 == 0)) {
                      auVar137 = vfmadd231ps_avx512f(auVar137,*(undefined1 (*) [64])
                                                               ((long)pvVar13 +
                                                               (long)(iVar60 << 4) * 4 +
                                                               (long)iVar59 * (long)iVar67 * sVar12
                                                               + sVar78 * uVar68 * sVar12),
                                                     *(undefined1 (*) [64])((long)pvVar72 + lVar77))
                      ;
                    }
                    iVar58 = iVar58 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar72 = (void *)((long)pvVar72 + (long)(int)uVar79 * 0x40);
              }
              switch((this->super_DeconvolutionDepthWise).activation_type) {
              case 1:
                auVar137 = vmaxps_avx512f(auVar137,auVar183);
                break;
              case 2:
                uVar80 = vcmpps_avx512f(auVar137,auVar183,1);
                uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                auVar34._4_4_ = uVar1;
                auVar34._0_4_ = uVar1;
                auVar34._8_4_ = uVar1;
                auVar34._12_4_ = uVar1;
                auVar34._16_4_ = uVar1;
                auVar34._20_4_ = uVar1;
                auVar34._24_4_ = uVar1;
                auVar34._28_4_ = uVar1;
                auVar34._32_4_ = uVar1;
                auVar34._36_4_ = uVar1;
                auVar34._40_4_ = uVar1;
                auVar34._44_4_ = uVar1;
                auVar34._48_4_ = uVar1;
                auVar34._52_4_ = uVar1;
                auVar34._56_4_ = uVar1;
                auVar34._60_4_ = uVar1;
                auVar145 = vmulps_avx512f(auVar137,auVar34);
                bVar18 = (bool)((byte)uVar80 & 1);
                auVar143._0_4_ = (uint)bVar18 * auVar145._0_4_ | (uint)!bVar18 * auVar137._0_4_;
                bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar143._4_4_ = (uint)bVar18 * auVar145._4_4_ | (uint)!bVar18 * auVar137._4_4_;
                bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar143._8_4_ = (uint)bVar18 * auVar145._8_4_ | (uint)!bVar18 * auVar137._8_4_;
                bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar143._12_4_ = (uint)bVar18 * auVar145._12_4_ | (uint)!bVar18 * auVar137._12_4_;
                bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar143._16_4_ = (uint)bVar18 * auVar145._16_4_ | (uint)!bVar18 * auVar137._16_4_;
                bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar143._20_4_ = (uint)bVar18 * auVar145._20_4_ | (uint)!bVar18 * auVar137._20_4_;
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar143._24_4_ = (uint)bVar18 * auVar145._24_4_ | (uint)!bVar18 * auVar137._24_4_;
                bVar18 = (bool)((byte)(uVar80 >> 7) & 1);
                auVar143._28_4_ = (uint)bVar18 * auVar145._28_4_ | (uint)!bVar18 * auVar137._28_4_;
                bVar18 = (bool)((byte)(uVar80 >> 8) & 1);
                auVar143._32_4_ = (uint)bVar18 * auVar145._32_4_ | (uint)!bVar18 * auVar137._32_4_;
                bVar18 = (bool)((byte)(uVar80 >> 9) & 1);
                auVar143._36_4_ = (uint)bVar18 * auVar145._36_4_ | (uint)!bVar18 * auVar137._36_4_;
                bVar18 = (bool)((byte)(uVar80 >> 10) & 1);
                auVar143._40_4_ = (uint)bVar18 * auVar145._40_4_ | (uint)!bVar18 * auVar137._40_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xb) & 1);
                auVar143._44_4_ = (uint)bVar18 * auVar145._44_4_ | (uint)!bVar18 * auVar137._44_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xc) & 1);
                auVar143._48_4_ = (uint)bVar18 * auVar145._48_4_ | (uint)!bVar18 * auVar137._48_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xd) & 1);
                auVar143._52_4_ = (uint)bVar18 * auVar145._52_4_ | (uint)!bVar18 * auVar137._52_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xe) & 1);
                auVar143._56_4_ = (uint)bVar18 * auVar145._56_4_ | (uint)!bVar18 * auVar137._56_4_;
                bVar18 = SUB81(uVar80 >> 0xf,0);
                auVar143._60_4_ = (uint)bVar18 * auVar145._60_4_ | (uint)!bVar18 * auVar137._60_4_;
                auVar137 = auVar143;
                break;
              case 3:
                puVar15 = (undefined4 *)(this->super_DeconvolutionDepthWise).activation_params.data;
                uVar1 = *puVar15;
                auVar33._4_4_ = uVar1;
                auVar33._0_4_ = uVar1;
                auVar33._8_4_ = uVar1;
                auVar33._12_4_ = uVar1;
                auVar33._16_4_ = uVar1;
                auVar33._20_4_ = uVar1;
                auVar33._24_4_ = uVar1;
                auVar33._28_4_ = uVar1;
                auVar33._32_4_ = uVar1;
                auVar33._36_4_ = uVar1;
                auVar33._40_4_ = uVar1;
                auVar33._44_4_ = uVar1;
                auVar33._48_4_ = uVar1;
                auVar33._52_4_ = uVar1;
                auVar33._56_4_ = uVar1;
                auVar33._60_4_ = uVar1;
                auVar145 = vmaxps_avx512f(auVar137,auVar33);
                uVar1 = puVar15[1];
                auVar137._4_4_ = uVar1;
                auVar137._0_4_ = uVar1;
                auVar137._8_4_ = uVar1;
                auVar137._12_4_ = uVar1;
                auVar137._16_4_ = uVar1;
                auVar137._20_4_ = uVar1;
                auVar137._24_4_ = uVar1;
                auVar137._28_4_ = uVar1;
                auVar137._32_4_ = uVar1;
                auVar137._36_4_ = uVar1;
                auVar137._40_4_ = uVar1;
                auVar137._44_4_ = uVar1;
                auVar137._48_4_ = uVar1;
                auVar137._52_4_ = uVar1;
                auVar137._56_4_ = uVar1;
                auVar137._60_4_ = uVar1;
                auVar137 = vminps_avx512f(auVar145,auVar137);
                break;
              case 4:
                auVar137 = vxorps_avx512dq(auVar137,auVar149);
                auVar137 = vminps_avx512f(auVar137,(undefined1  [64])afVar36);
                auVar137 = vmaxps_avx512f(auVar137,(undefined1  [64])afVar37);
                auVar145 = vfmadd213ps_avx512f((undefined1  [64])afVar38,auVar137,
                                               (undefined1  [64])afVar44);
                auVar144 = vrndscaleps_avx512f(auVar145,1);
                uVar80 = vcmpps_avx512f(auVar145,auVar144,1);
                auVar145 = vsubps_avx512f(auVar144,(undefined1  [64])afVar35);
                bVar18 = (bool)((byte)uVar80 & 1);
                auVar142._0_4_ = (uint)bVar18 * auVar145._0_4_ | (uint)!bVar18 * auVar144._0_4_;
                bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar142._4_4_ = (uint)bVar18 * auVar145._4_4_ | (uint)!bVar18 * auVar144._4_4_;
                bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar142._8_4_ = (uint)bVar18 * auVar145._8_4_ | (uint)!bVar18 * auVar144._8_4_;
                bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar142._12_4_ = (uint)bVar18 * auVar145._12_4_ | (uint)!bVar18 * auVar144._12_4_;
                bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar142._16_4_ = (uint)bVar18 * auVar145._16_4_ | (uint)!bVar18 * auVar144._16_4_;
                bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar142._20_4_ = (uint)bVar18 * auVar145._20_4_ | (uint)!bVar18 * auVar144._20_4_;
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar142._24_4_ = (uint)bVar18 * auVar145._24_4_ | (uint)!bVar18 * auVar144._24_4_;
                bVar18 = (bool)((byte)(uVar80 >> 7) & 1);
                auVar142._28_4_ = (uint)bVar18 * auVar145._28_4_ | (uint)!bVar18 * auVar144._28_4_;
                bVar18 = (bool)((byte)(uVar80 >> 8) & 1);
                auVar142._32_4_ = (uint)bVar18 * auVar145._32_4_ | (uint)!bVar18 * auVar144._32_4_;
                bVar18 = (bool)((byte)(uVar80 >> 9) & 1);
                auVar142._36_4_ = (uint)bVar18 * auVar145._36_4_ | (uint)!bVar18 * auVar144._36_4_;
                bVar18 = (bool)((byte)(uVar80 >> 10) & 1);
                auVar142._40_4_ = (uint)bVar18 * auVar145._40_4_ | (uint)!bVar18 * auVar144._40_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xb) & 1);
                auVar142._44_4_ = (uint)bVar18 * auVar145._44_4_ | (uint)!bVar18 * auVar144._44_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xc) & 1);
                auVar142._48_4_ = (uint)bVar18 * auVar145._48_4_ | (uint)!bVar18 * auVar144._48_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xd) & 1);
                auVar142._52_4_ = (uint)bVar18 * auVar145._52_4_ | (uint)!bVar18 * auVar144._52_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xe) & 1);
                auVar142._56_4_ = (uint)bVar18 * auVar145._56_4_ | (uint)!bVar18 * auVar144._56_4_;
                bVar18 = SUB81(uVar80 >> 0xf,0);
                auVar142._60_4_ = (uint)bVar18 * auVar145._60_4_ | (uint)!bVar18 * auVar144._60_4_;
                auVar137 = vfmadd231ps_avx512f(auVar137,auVar142,auVar131);
                auVar137 = vfmadd231ps_avx512f(auVar137,auVar142,auVar132);
                auVar145 = vmulps_avx512f(auVar137,auVar137);
                auVar144 = vfmadd213ps_avx512f(auVar137,(undefined1  [64])afVar39,
                                               (undefined1  [64])afVar40);
                auVar144 = vfmadd213ps_avx512f(auVar144,auVar137,(undefined1  [64])afVar41);
                auVar144 = vfmadd213ps_avx512f(auVar144,auVar137,(undefined1  [64])afVar42);
                auVar144 = vfmadd213ps_avx512f(auVar144,auVar137,(undefined1  [64])afVar43);
                auVar144 = vfmadd213ps_avx512f(auVar144,auVar137,(undefined1  [64])afVar44);
                auVar137 = vfmadd213ps_avx512f(auVar144,auVar145,auVar137);
                auVar137 = vaddps_avx512f(auVar137,(undefined1  [64])afVar35);
                auVar145 = vcvttps2dq_avx512f(auVar142);
                auVar145 = vpaddd_avx512f(auVar133,auVar145);
                auVar145 = vpslld_avx512f(auVar145,0x17);
                auVar137 = vfmadd213ps_avx512f(auVar145,auVar137,auVar135);
                auVar137 = vdivps_avx512f(auVar135,auVar137);
                break;
              case 5:
                auVar145 = vminps_avx512f(auVar137,(undefined1  [64])afVar36);
                auVar145 = vmaxps_avx512f(auVar145,(undefined1  [64])afVar37);
                auVar144 = vfmadd213ps_avx512f((undefined1  [64])afVar38,auVar145,
                                               (undefined1  [64])afVar44);
                auVar138 = vrndscaleps_avx512f(auVar144,1);
                uVar80 = vcmpps_avx512f(auVar144,auVar138,1);
                auVar144 = vsubps_avx512f(auVar138,(undefined1  [64])afVar35);
                bVar18 = (bool)((byte)uVar80 & 1);
                auVar139._0_4_ = (uint)bVar18 * auVar144._0_4_ | (uint)!bVar18 * auVar138._0_4_;
                bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar139._4_4_ = (uint)bVar18 * auVar144._4_4_ | (uint)!bVar18 * auVar138._4_4_;
                bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar139._8_4_ = (uint)bVar18 * auVar144._8_4_ | (uint)!bVar18 * auVar138._8_4_;
                bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar139._12_4_ = (uint)bVar18 * auVar144._12_4_ | (uint)!bVar18 * auVar138._12_4_;
                bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar139._16_4_ = (uint)bVar18 * auVar144._16_4_ | (uint)!bVar18 * auVar138._16_4_;
                bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar139._20_4_ = (uint)bVar18 * auVar144._20_4_ | (uint)!bVar18 * auVar138._20_4_;
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar139._24_4_ = (uint)bVar18 * auVar144._24_4_ | (uint)!bVar18 * auVar138._24_4_;
                bVar18 = (bool)((byte)(uVar80 >> 7) & 1);
                auVar139._28_4_ = (uint)bVar18 * auVar144._28_4_ | (uint)!bVar18 * auVar138._28_4_;
                bVar18 = (bool)((byte)(uVar80 >> 8) & 1);
                auVar139._32_4_ = (uint)bVar18 * auVar144._32_4_ | (uint)!bVar18 * auVar138._32_4_;
                bVar18 = (bool)((byte)(uVar80 >> 9) & 1);
                auVar139._36_4_ = (uint)bVar18 * auVar144._36_4_ | (uint)!bVar18 * auVar138._36_4_;
                bVar18 = (bool)((byte)(uVar80 >> 10) & 1);
                auVar139._40_4_ = (uint)bVar18 * auVar144._40_4_ | (uint)!bVar18 * auVar138._40_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xb) & 1);
                auVar139._44_4_ = (uint)bVar18 * auVar144._44_4_ | (uint)!bVar18 * auVar138._44_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xc) & 1);
                auVar139._48_4_ = (uint)bVar18 * auVar144._48_4_ | (uint)!bVar18 * auVar138._48_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xd) & 1);
                auVar139._52_4_ = (uint)bVar18 * auVar144._52_4_ | (uint)!bVar18 * auVar138._52_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xe) & 1);
                auVar139._56_4_ = (uint)bVar18 * auVar144._56_4_ | (uint)!bVar18 * auVar138._56_4_;
                bVar18 = SUB81(uVar80 >> 0xf,0);
                auVar139._60_4_ = (uint)bVar18 * auVar144._60_4_ | (uint)!bVar18 * auVar138._60_4_;
                auVar145 = vfmadd231ps_avx512f(auVar145,auVar139,auVar131);
                auVar145 = vfmadd231ps_avx512f(auVar145,auVar139,auVar132);
                auVar144 = vmulps_avx512f(auVar145,auVar145);
                auVar138 = vfmadd213ps_avx512f(auVar145,(undefined1  [64])afVar39,
                                               (undefined1  [64])afVar40);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar145,(undefined1  [64])afVar41);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar145,(undefined1  [64])afVar42);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar145,(undefined1  [64])afVar43);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar145,(undefined1  [64])afVar44);
                auVar145 = vfmadd213ps_avx512f(auVar138,auVar144,auVar145);
                auVar145 = vaddps_avx512f(auVar145,(undefined1  [64])afVar35);
                auVar144 = vcvttps2dq_avx512f(auVar139);
                auVar144 = vpaddd_avx512f(auVar133,auVar144);
                auVar144 = vpslld_avx512f(auVar144,0x17);
                auVar145 = vfmadd213ps_avx512f(auVar144,auVar145,auVar135);
                auVar144 = vmaxps_avx512f(auVar145,(undefined1  [64])_ps512_min_norm_pos);
                auVar138 = vpsrld_avx512f(auVar144,0x17);
                auVar144 = vpternlogd_avx512f(auVar144,(undefined1  [64])afVar44,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar80 = vcmpps_avx512f(auVar144,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar139 = vsubps_avx512f(auVar144,(undefined1  [64])afVar35);
                auVar140 = vaddps_avx512f(auVar139,auVar144);
                bVar18 = (bool)((byte)uVar80 & 1);
                auVar144._0_4_ = (uint)bVar18 * auVar140._0_4_ | (uint)!bVar18 * auVar139._0_4_;
                bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar144._4_4_ = (uint)bVar18 * auVar140._4_4_ | (uint)!bVar18 * auVar139._4_4_;
                bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar144._8_4_ = (uint)bVar18 * auVar140._8_4_ | (uint)!bVar18 * auVar139._8_4_;
                bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar144._12_4_ = (uint)bVar18 * auVar140._12_4_ | (uint)!bVar18 * auVar139._12_4_;
                bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar144._16_4_ = (uint)bVar18 * auVar140._16_4_ | (uint)!bVar18 * auVar139._16_4_;
                bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar144._20_4_ = (uint)bVar18 * auVar140._20_4_ | (uint)!bVar18 * auVar139._20_4_;
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar144._24_4_ = (uint)bVar18 * auVar140._24_4_ | (uint)!bVar18 * auVar139._24_4_;
                bVar18 = (bool)((byte)(uVar80 >> 7) & 1);
                auVar144._28_4_ = (uint)bVar18 * auVar140._28_4_ | (uint)!bVar18 * auVar139._28_4_;
                bVar19 = (byte)(uVar80 >> 8);
                bVar18 = (bool)(bVar19 & 1);
                auVar144._32_4_ = (uint)bVar18 * auVar140._32_4_ | (uint)!bVar18 * auVar139._32_4_;
                bVar18 = (bool)((byte)(uVar80 >> 9) & 1);
                auVar144._36_4_ = (uint)bVar18 * auVar140._36_4_ | (uint)!bVar18 * auVar139._36_4_;
                bVar18 = (bool)((byte)(uVar80 >> 10) & 1);
                auVar144._40_4_ = (uint)bVar18 * auVar140._40_4_ | (uint)!bVar18 * auVar139._40_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xb) & 1);
                auVar144._44_4_ = (uint)bVar18 * auVar140._44_4_ | (uint)!bVar18 * auVar139._44_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xc) & 1);
                auVar144._48_4_ = (uint)bVar18 * auVar140._48_4_ | (uint)!bVar18 * auVar139._48_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xd) & 1);
                auVar144._52_4_ = (uint)bVar18 * auVar140._52_4_ | (uint)!bVar18 * auVar139._52_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xe) & 1);
                auVar144._56_4_ = (uint)bVar18 * auVar140._56_4_ | (uint)!bVar18 * auVar139._56_4_;
                bVar18 = SUB81(uVar80 >> 0xf,0);
                auVar144._60_4_ = (uint)bVar18 * auVar140._60_4_ | (uint)!bVar18 * auVar139._60_4_;
                auVar139 = vmulps_avx512f(auVar144,auVar144);
                auVar140 = vfmadd132ps_avx512f(auVar144,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar140 = vfmadd213ps_avx512f(auVar140,auVar144,(undefined1  [64])afVar45);
                auVar140 = vfmadd213ps_avx512f(auVar140,auVar144,(undefined1  [64])afVar46);
                auVar140 = vfmadd213ps_avx512f(auVar140,auVar144,(undefined1  [64])afVar47);
                auVar140 = vfmadd213ps_avx512f(auVar140,auVar144,(undefined1  [64])afVar48);
                auVar140 = vfmadd213ps_avx512f(auVar140,auVar144,(undefined1  [64])afVar49);
                auVar140 = vfmadd213ps_avx512f(auVar140,auVar144,(undefined1  [64])afVar50);
                auVar140 = vfmadd213ps_avx512f(auVar140,auVar144,(undefined1  [64])afVar51);
                auVar141 = vmulps_avx512f(auVar139,auVar144);
                auVar144 = vfmadd213ps_avx512f(auVar141,auVar140,auVar144);
                uVar81 = vcmpps_avx512f(auVar145,auVar183,2);
                auVar145 = vpsubd_avx512f(auVar138,auVar133);
                auVar145 = vcvtdq2ps_avx512f(auVar145);
                auVar138 = vaddps_avx512f(auVar145,(undefined1  [64])afVar35);
                bVar18 = (bool)((byte)uVar80 & 1);
                auVar140._0_4_ = (uint)bVar18 * auVar145._0_4_ | (uint)!bVar18 * auVar138._0_4_;
                bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar140._4_4_ = (uint)bVar18 * auVar145._4_4_ | (uint)!bVar18 * auVar138._4_4_;
                bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar140._8_4_ = (uint)bVar18 * auVar145._8_4_ | (uint)!bVar18 * auVar138._8_4_;
                bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar140._12_4_ = (uint)bVar18 * auVar145._12_4_ | (uint)!bVar18 * auVar138._12_4_;
                bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar140._16_4_ = (uint)bVar18 * auVar145._16_4_ | (uint)!bVar18 * auVar138._16_4_;
                bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar140._20_4_ = (uint)bVar18 * auVar145._20_4_ | (uint)!bVar18 * auVar138._20_4_;
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar140._24_4_ = (uint)bVar18 * auVar145._24_4_ | (uint)!bVar18 * auVar138._24_4_;
                bVar18 = (bool)((byte)(uVar80 >> 7) & 1);
                auVar140._28_4_ = (uint)bVar18 * auVar145._28_4_ | (uint)!bVar18 * auVar138._28_4_;
                bVar18 = (bool)(bVar19 & 1);
                auVar140._32_4_ = (uint)bVar18 * auVar145._32_4_ | (uint)!bVar18 * auVar138._32_4_;
                bVar18 = (bool)((byte)(uVar80 >> 9) & 1);
                auVar140._36_4_ = (uint)bVar18 * auVar145._36_4_ | (uint)!bVar18 * auVar138._36_4_;
                bVar18 = (bool)((byte)(uVar80 >> 10) & 1);
                auVar140._40_4_ = (uint)bVar18 * auVar145._40_4_ | (uint)!bVar18 * auVar138._40_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xb) & 1);
                auVar140._44_4_ = (uint)bVar18 * auVar145._44_4_ | (uint)!bVar18 * auVar138._44_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xc) & 1);
                auVar140._48_4_ = (uint)bVar18 * auVar145._48_4_ | (uint)!bVar18 * auVar138._48_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xd) & 1);
                auVar140._52_4_ = (uint)bVar18 * auVar145._52_4_ | (uint)!bVar18 * auVar138._52_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xe) & 1);
                auVar140._56_4_ = (uint)bVar18 * auVar145._56_4_ | (uint)!bVar18 * auVar138._56_4_;
                bVar18 = SUB81(uVar80 >> 0xf,0);
                auVar140._60_4_ = (uint)bVar18 * auVar145._60_4_ | (uint)!bVar18 * auVar138._60_4_;
                auVar145 = vfmadd231ps_avx512f(auVar144,auVar140,
                                               (undefined1  [64])_ps512_cephes_log_q1);
                auVar145 = vfmadd231ps_avx512f(auVar145,auVar134,auVar139);
                auVar145 = vfmadd231ps_avx512f(auVar145,auVar140,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar145 = vmulps_avx512f(auVar145,auVar136);
                auVar144 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar18 = (bool)((byte)uVar81 & 1);
                auVar138._0_4_ = (uint)bVar18 * auVar144._0_4_ | (uint)!bVar18 * auVar145._0_4_;
                bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar138._4_4_ = (uint)bVar18 * auVar144._4_4_ | (uint)!bVar18 * auVar145._4_4_;
                bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar138._8_4_ = (uint)bVar18 * auVar144._8_4_ | (uint)!bVar18 * auVar145._8_4_;
                bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar138._12_4_ = (uint)bVar18 * auVar144._12_4_ | (uint)!bVar18 * auVar145._12_4_;
                bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar138._16_4_ = (uint)bVar18 * auVar144._16_4_ | (uint)!bVar18 * auVar145._16_4_;
                bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar138._20_4_ = (uint)bVar18 * auVar144._20_4_ | (uint)!bVar18 * auVar145._20_4_;
                bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar138._24_4_ = (uint)bVar18 * auVar144._24_4_ | (uint)!bVar18 * auVar145._24_4_;
                bVar18 = (bool)((byte)(uVar81 >> 7) & 1);
                auVar138._28_4_ = (uint)bVar18 * auVar144._28_4_ | (uint)!bVar18 * auVar145._28_4_;
                bVar18 = (bool)((byte)(uVar81 >> 8) & 1);
                auVar138._32_4_ = (uint)bVar18 * auVar144._32_4_ | (uint)!bVar18 * auVar145._32_4_;
                bVar18 = (bool)((byte)(uVar81 >> 9) & 1);
                auVar138._36_4_ = (uint)bVar18 * auVar144._36_4_ | (uint)!bVar18 * auVar145._36_4_;
                bVar18 = (bool)((byte)(uVar81 >> 10) & 1);
                auVar138._40_4_ = (uint)bVar18 * auVar144._40_4_ | (uint)!bVar18 * auVar145._40_4_;
                bVar18 = (bool)((byte)(uVar81 >> 0xb) & 1);
                auVar138._44_4_ = (uint)bVar18 * auVar144._44_4_ | (uint)!bVar18 * auVar145._44_4_;
                bVar18 = (bool)((byte)(uVar81 >> 0xc) & 1);
                auVar138._48_4_ = (uint)bVar18 * auVar144._48_4_ | (uint)!bVar18 * auVar145._48_4_;
                bVar18 = (bool)((byte)(uVar81 >> 0xd) & 1);
                auVar138._52_4_ = (uint)bVar18 * auVar144._52_4_ | (uint)!bVar18 * auVar145._52_4_;
                bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                auVar138._56_4_ = (uint)bVar18 * auVar144._56_4_ | (uint)!bVar18 * auVar145._56_4_;
                bVar18 = SUB81(uVar81 >> 0xf,0);
                auVar138._60_4_ = (uint)bVar18 * auVar144._60_4_ | (uint)!bVar18 * auVar145._60_4_;
                auVar145 = vminps_avx512f(auVar138,(undefined1  [64])afVar36);
                auVar145 = vmaxps_avx512f(auVar145,(undefined1  [64])afVar37);
                auVar144 = vfmadd213ps_avx512f((undefined1  [64])afVar38,auVar145,
                                               (undefined1  [64])afVar44);
                auVar138 = vrndscaleps_avx512f(auVar144,1);
                uVar80 = vcmpps_avx512f(auVar144,auVar138,1);
                auVar144 = vsubps_avx512f(auVar138,(undefined1  [64])afVar35);
                bVar18 = (bool)((byte)uVar80 & 1);
                auVar141._0_4_ = (uint)bVar18 * auVar144._0_4_ | (uint)!bVar18 * auVar138._0_4_;
                bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar141._4_4_ = (uint)bVar18 * auVar144._4_4_ | (uint)!bVar18 * auVar138._4_4_;
                bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar141._8_4_ = (uint)bVar18 * auVar144._8_4_ | (uint)!bVar18 * auVar138._8_4_;
                bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar141._12_4_ = (uint)bVar18 * auVar144._12_4_ | (uint)!bVar18 * auVar138._12_4_;
                bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar141._16_4_ = (uint)bVar18 * auVar144._16_4_ | (uint)!bVar18 * auVar138._16_4_;
                bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar141._20_4_ = (uint)bVar18 * auVar144._20_4_ | (uint)!bVar18 * auVar138._20_4_;
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar141._24_4_ = (uint)bVar18 * auVar144._24_4_ | (uint)!bVar18 * auVar138._24_4_;
                bVar18 = (bool)((byte)(uVar80 >> 7) & 1);
                auVar141._28_4_ = (uint)bVar18 * auVar144._28_4_ | (uint)!bVar18 * auVar138._28_4_;
                bVar18 = (bool)((byte)(uVar80 >> 8) & 1);
                auVar141._32_4_ = (uint)bVar18 * auVar144._32_4_ | (uint)!bVar18 * auVar138._32_4_;
                bVar18 = (bool)((byte)(uVar80 >> 9) & 1);
                auVar141._36_4_ = (uint)bVar18 * auVar144._36_4_ | (uint)!bVar18 * auVar138._36_4_;
                bVar18 = (bool)((byte)(uVar80 >> 10) & 1);
                auVar141._40_4_ = (uint)bVar18 * auVar144._40_4_ | (uint)!bVar18 * auVar138._40_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xb) & 1);
                auVar141._44_4_ = (uint)bVar18 * auVar144._44_4_ | (uint)!bVar18 * auVar138._44_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xc) & 1);
                auVar141._48_4_ = (uint)bVar18 * auVar144._48_4_ | (uint)!bVar18 * auVar138._48_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xd) & 1);
                auVar141._52_4_ = (uint)bVar18 * auVar144._52_4_ | (uint)!bVar18 * auVar138._52_4_;
                bVar18 = (bool)((byte)(uVar80 >> 0xe) & 1);
                auVar141._56_4_ = (uint)bVar18 * auVar144._56_4_ | (uint)!bVar18 * auVar138._56_4_;
                bVar18 = SUB81(uVar80 >> 0xf,0);
                auVar141._60_4_ = (uint)bVar18 * auVar144._60_4_ | (uint)!bVar18 * auVar138._60_4_;
                auVar145 = vfmadd231ps_avx512f(auVar145,auVar141,auVar131);
                auVar145 = vfmadd231ps_avx512f(auVar145,auVar141,auVar132);
                auVar144 = vmulps_avx512f(auVar145,auVar145);
                auVar138 = vfmadd213ps_avx512f(auVar145,(undefined1  [64])afVar39,
                                               (undefined1  [64])afVar40);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar145,(undefined1  [64])afVar41);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar145,(undefined1  [64])afVar42);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar145,(undefined1  [64])afVar43);
                auVar138 = vfmadd213ps_avx512f(auVar138,auVar145,(undefined1  [64])afVar44);
                auVar145 = vfmadd213ps_avx512f(auVar138,auVar144,auVar145);
                auVar145 = vaddps_avx512f(auVar145,(undefined1  [64])afVar35);
                auVar144 = vcvttps2dq_avx512f(auVar141);
                auVar144 = vpaddd_avx512f(auVar144,auVar133);
                auVar144 = vpslld_avx512f(auVar144,0x17);
                auVar145 = vfmadd213ps_avx512f(auVar144,auVar145,auVar135);
                auVar145 = vdivps_avx512f(auVar135,auVar145);
                auVar145 = vfnmsub213ps_avx512f(auVar145,auVar136,auVar135);
                goto LAB_003e8bc8;
              case 6:
                puVar11 = (uint *)(this->super_DeconvolutionDepthWise).activation_params.data;
                auVar144 = vbroadcastss_avx512f(ZEXT416(*puVar11));
                uVar79 = puVar11[1];
                auVar145._4_4_ = uVar79;
                auVar145._0_4_ = uVar79;
                auVar145._8_4_ = uVar79;
                auVar145._12_4_ = uVar79;
                auVar145._16_4_ = uVar79;
                auVar145._20_4_ = uVar79;
                auVar145._24_4_ = uVar79;
                auVar145._28_4_ = uVar79;
                auVar145._32_4_ = uVar79;
                auVar145._36_4_ = uVar79;
                auVar145._40_4_ = uVar79;
                auVar145._44_4_ = uVar79;
                auVar145._48_4_ = uVar79;
                auVar145._52_4_ = uVar79;
                auVar145._56_4_ = uVar79;
                auVar145._60_4_ = uVar79;
                auVar145 = vfmadd213ps_avx512f(auVar144,auVar137,auVar145);
                auVar145 = vmaxps_avx512f(auVar145,auVar183);
                auVar145 = vminps_avx512f(auVar145,auVar135);
LAB_003e8bc8:
                auVar137 = vmulps_avx512f(auVar145,auVar137);
              }
              *pauVar73 = auVar137;
              pauVar73 = pauVar73 + 1;
              iVar2 = iVar2 + 1;
            }
          }
          iVar57 = iVar57 + iVar55 * 0x10;
        }
      }
      else if (iVar57 == 8) {
        if (iVar71 < 1) {
          iVar71 = 0;
        }
        if (iVar76 < 1) {
          iVar76 = 0;
        }
        if ((int)uVar56 < 1) {
          uVar83 = 0;
        }
        local_1d0 = CONCAT44(local_1d0._4_4_,iVar55 * 8);
        auVar151._8_4_ = 0x42b0c0a5;
        auVar151._0_8_ = 0x42b0c0a542b0c0a5;
        auVar151._12_4_ = 0x42b0c0a5;
        auVar151._16_4_ = 0x42b0c0a5;
        auVar151._20_4_ = 0x42b0c0a5;
        auVar151._24_4_ = 0x42b0c0a5;
        auVar151._28_4_ = 0x42b0c0a5;
        auVar154._8_4_ = 0xc2b0c0a5;
        auVar154._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar154._12_4_ = 0xc2b0c0a5;
        auVar154._16_4_ = 0xc2b0c0a5;
        auVar154._20_4_ = 0xc2b0c0a5;
        auVar154._24_4_ = 0xc2b0c0a5;
        auVar154._28_4_ = 0xc2b0c0a5;
        auVar156._8_4_ = 0x3f000000;
        auVar156._0_8_ = 0x3f0000003f000000;
        auVar156._12_4_ = 0x3f000000;
        auVar156._16_4_ = 0x3f000000;
        auVar156._20_4_ = 0x3f000000;
        auVar156._24_4_ = 0x3f000000;
        auVar156._28_4_ = 0x3f000000;
        auVar158._8_4_ = 0x3fb8aa3b;
        auVar158._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar158._12_4_ = 0x3fb8aa3b;
        auVar158._16_4_ = 0x3fb8aa3b;
        auVar158._20_4_ = 0x3fb8aa3b;
        auVar158._24_4_ = 0x3fb8aa3b;
        auVar158._28_4_ = 0x3fb8aa3b;
        auVar160._8_4_ = 0x3f800000;
        auVar160._0_8_ = 0x3f8000003f800000;
        auVar160._12_4_ = 0x3f800000;
        auVar160._16_4_ = 0x3f800000;
        auVar160._20_4_ = 0x3f800000;
        auVar160._24_4_ = 0x3f800000;
        auVar160._28_4_ = 0x3f800000;
        auVar162._8_4_ = 0x3f318000;
        auVar162._0_8_ = 0x3f3180003f318000;
        auVar162._12_4_ = 0x3f318000;
        auVar162._16_4_ = 0x3f318000;
        auVar162._20_4_ = 0x3f318000;
        auVar162._24_4_ = 0x3f318000;
        auVar162._28_4_ = 0x3f318000;
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar172._8_4_ = 0x3ab743ce;
        auVar172._0_8_ = 0x3ab743ce3ab743ce;
        auVar172._12_4_ = 0x3ab743ce;
        auVar172._16_4_ = 0x3ab743ce;
        auVar172._20_4_ = 0x3ab743ce;
        auVar172._24_4_ = 0x3ab743ce;
        auVar172._28_4_ = 0x3ab743ce;
        auVar174._8_4_ = 0x3c088908;
        auVar174._0_8_ = 0x3c0889083c088908;
        auVar174._12_4_ = 0x3c088908;
        auVar174._16_4_ = 0x3c088908;
        auVar174._20_4_ = 0x3c088908;
        auVar174._24_4_ = 0x3c088908;
        auVar174._28_4_ = 0x3c088908;
        auVar176._8_4_ = 0x3d2aa9c1;
        auVar176._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar176._12_4_ = 0x3d2aa9c1;
        auVar176._16_4_ = 0x3d2aa9c1;
        auVar176._20_4_ = 0x3d2aa9c1;
        auVar176._24_4_ = 0x3d2aa9c1;
        auVar176._28_4_ = 0x3d2aa9c1;
        auVar178._8_4_ = 0x3e2aaaaa;
        auVar178._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar178._12_4_ = 0x3e2aaaaa;
        auVar178._16_4_ = 0x3e2aaaaa;
        auVar178._20_4_ = 0x3e2aaaaa;
        auVar178._24_4_ = 0x3e2aaaaa;
        auVar178._28_4_ = 0x3e2aaaaa;
        auVar180._8_4_ = 0x3f800000;
        auVar180._0_8_ = 0x3f8000003f800000;
        auVar180._12_4_ = 0x3f800000;
        auVar180._16_4_ = 0x3f800000;
        auVar180._20_4_ = 0x3f800000;
        auVar180._24_4_ = 0x3f800000;
        auVar180._28_4_ = 0x3f800000;
        auVar182._8_4_ = 0xb95e8083;
        auVar182._0_8_ = 0xb95e8083b95e8083;
        auVar182._12_4_ = 0xb95e8083;
        auVar182._16_4_ = 0xb95e8083;
        auVar182._20_4_ = 0xb95e8083;
        auVar182._24_4_ = 0xb95e8083;
        auVar182._28_4_ = 0xb95e8083;
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        iVar57 = 0;
        for (uVar68 = 0; local_1c8 = uVar83, uVar68 != uVar83; uVar68 = uVar68 + 1) {
          pauVar74 = (undefined1 (*) [32])
                     (local_218.cstep * uVar68 * local_218.elemsize + (long)local_218.data);
          iVar67 = bottom_blob->w;
          sVar78 = bottom_blob->cstep;
          sVar12 = bottom_blob->elemsize;
          pvVar13 = bottom_blob->data;
          pvVar14 = (this->weight_data_tm).data;
          for (iVar61 = 0; iVar61 != iVar76; iVar61 = iVar61 + 1) {
            iVar2 = -iVar82;
            for (iVar66 = 0; iVar66 != iVar71; iVar66 = iVar66 + 1) {
              if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                auVar149 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar149 = ZEXT3264(*(undefined1 (*) [32])
                                     ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                                     uVar68 * 0x20));
              }
              iVar63 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar79 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar56 = (this->super_DeconvolutionDepthWise).kernel_h;
              uVar80 = 0;
              if (0 < (int)uVar79) {
                uVar80 = (ulong)uVar79;
              }
              iVar9 = (this->super_DeconvolutionDepthWise).stride_w;
              if ((int)uVar56 < 1) {
                uVar56 = 0;
              }
              pvVar72 = (void *)((long)iVar57 * 4 + (long)pvVar14);
              for (uVar81 = 0; uVar81 != uVar56; uVar81 = uVar81 + 1) {
                iVar58 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar81 +
                         (iVar61 - iVar65);
                if ((-1 < iVar58) &&
                   (iVar59 = iVar58 / iVar63, iVar59 < iVar69 && iVar58 % iVar63 == 0)) {
                  iVar58 = iVar2;
                  for (lVar77 = 0; uVar80 * 0x20 != lVar77; lVar77 = lVar77 + 0x20) {
                    if ((-1 < iVar58) &&
                       (iVar60 = iVar58 / iVar9, iVar60 < iVar64 && iVar58 % iVar9 == 0)) {
                      auVar85 = vfmadd231ps_fma(auVar149._0_32_,
                                                *(undefined1 (*) [32])
                                                 ((long)pvVar13 +
                                                 (long)(iVar60 << 3) * 4 +
                                                 (long)iVar59 * (long)iVar67 * sVar12 +
                                                 sVar78 * uVar68 * sVar12),
                                                *(undefined1 (*) [32])((long)pvVar72 + lVar77));
                      auVar149 = ZEXT1664(auVar85);
                    }
                    iVar58 = iVar58 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar72 = (void *)((long)pvVar72 + (long)(int)uVar79 * 0x20);
              }
              iVar63 = (this->super_DeconvolutionDepthWise).activation_type;
              auVar121 = auVar149._0_32_;
              auVar130 = auVar121;
              if (5 < iVar63 - 1U) goto switchD_003e8f9c_caseD_1;
              auVar125 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              auVar130 = vmaxps_avx(auVar121,auVar125);
              switch(iVar63) {
              case 2:
                auVar121 = vminps_avx(auVar121,auVar125);
                uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                auVar32._4_4_ = uVar1;
                auVar32._0_4_ = uVar1;
                auVar32._8_4_ = uVar1;
                auVar32._12_4_ = uVar1;
                auVar32._16_4_ = uVar1;
                auVar32._20_4_ = uVar1;
                auVar32._24_4_ = uVar1;
                auVar32._28_4_ = uVar1;
                auVar130 = vfmadd231ps_avx512vl(auVar130,auVar121,auVar32);
                break;
              case 3:
                puVar15 = (undefined4 *)(this->super_DeconvolutionDepthWise).activation_params.data;
                uVar1 = *puVar15;
                auVar30._4_4_ = uVar1;
                auVar30._0_4_ = uVar1;
                auVar30._8_4_ = uVar1;
                auVar30._12_4_ = uVar1;
                auVar30._16_4_ = uVar1;
                auVar30._20_4_ = uVar1;
                auVar30._24_4_ = uVar1;
                auVar30._28_4_ = uVar1;
                auVar130 = vmaxps_avx512vl(auVar121,auVar30);
                uVar1 = puVar15[1];
                auVar31._4_4_ = uVar1;
                auVar31._0_4_ = uVar1;
                auVar31._8_4_ = uVar1;
                auVar31._12_4_ = uVar1;
                auVar31._16_4_ = uVar1;
                auVar31._20_4_ = uVar1;
                auVar31._24_4_ = uVar1;
                auVar31._28_4_ = uVar1;
                auVar130 = vminps_avx512vl(auVar130,auVar31);
                break;
              case 4:
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar28._16_4_ = 0x80000000;
                auVar28._20_4_ = 0x80000000;
                auVar28._24_4_ = 0x80000000;
                auVar28._28_4_ = 0x80000000;
                auVar130 = vxorps_avx512vl(auVar121,auVar28);
                auVar130 = vminps_avx(auVar130,auVar151);
                auVar130 = vmaxps_avx(auVar130,auVar154);
                auVar85 = vfmadd231ps_fma(auVar156,auVar130,auVar158);
                auVar121 = vrndscaleps_avx512vl(ZEXT1632(auVar85),1);
                uVar80 = vcmpps_avx512vl(ZEXT1632(auVar85),auVar121,1);
                auVar125 = vsubps_avx512vl(auVar121,auVar160);
                bVar18 = (bool)((byte)uVar80 & 1);
                auVar129._0_4_ = (uint)bVar18 * auVar125._0_4_ | (uint)!bVar18 * auVar121._0_4_;
                bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar129._4_4_ = (uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * auVar121._4_4_;
                bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar129._8_4_ = (uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * auVar121._8_4_;
                bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar129._12_4_ = (uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * auVar121._12_4_;
                bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar129._16_4_ = (uint)bVar18 * auVar125._16_4_ | (uint)!bVar18 * auVar121._16_4_;
                bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar129._20_4_ = (uint)bVar18 * auVar125._20_4_ | (uint)!bVar18 * auVar121._20_4_;
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar129._24_4_ = (uint)bVar18 * auVar125._24_4_ | (uint)!bVar18 * auVar121._24_4_;
                bVar18 = SUB81(uVar80 >> 7,0);
                auVar129._28_4_ = (uint)bVar18 * auVar125._28_4_ | (uint)!bVar18 * auVar121._28_4_;
                auVar130 = vfmsub231ps_avx512vl(auVar130,auVar129,auVar162);
                auVar29._8_4_ = 0x395e8083;
                auVar29._0_8_ = 0x395e8083395e8083;
                auVar29._12_4_ = 0x395e8083;
                auVar29._16_4_ = 0x395e8083;
                auVar29._20_4_ = 0x395e8083;
                auVar29._24_4_ = 0x395e8083;
                auVar29._28_4_ = 0x395e8083;
                auVar130 = vfmsub231ps_avx512vl(auVar130,auVar129,auVar29);
                auVar164._0_4_ = auVar130._0_4_ * auVar130._0_4_;
                auVar164._4_4_ = auVar130._4_4_ * auVar130._4_4_;
                auVar164._8_4_ = auVar130._8_4_ * auVar130._8_4_;
                auVar164._12_4_ = auVar130._12_4_ * auVar130._12_4_;
                auVar164._16_4_ = auVar130._16_4_ * auVar130._16_4_;
                auVar164._20_4_ = auVar130._20_4_ * auVar130._20_4_;
                auVar164._24_4_ = auVar130._24_4_ * auVar130._24_4_;
                auVar164._28_4_ = 0;
                auVar85 = vfmadd213ps_fma(auVar108,auVar130,auVar172);
                auVar85 = vfmadd213ps_fma(ZEXT1632(auVar85),auVar130,auVar174);
                auVar85 = vfmadd213ps_fma(ZEXT1632(auVar85),auVar130,auVar176);
                auVar85 = vfmadd213ps_fma(ZEXT1632(auVar85),auVar130,auVar178);
                auVar85 = vfmadd213ps_fma(ZEXT1632(auVar85),auVar130,auVar156);
                auVar85 = vfmadd213ps_fma(ZEXT1632(auVar85),auVar164,auVar130);
                auVar148._0_4_ = auVar85._0_4_ + 1.0;
                auVar148._4_4_ = auVar85._4_4_ + 1.0;
                auVar148._8_4_ = auVar85._8_4_ + 1.0;
                auVar148._12_4_ = auVar85._12_4_ + 1.0;
                auVar148._16_4_ = 0x3f800000;
                auVar148._20_4_ = 0x3f800000;
                auVar148._24_4_ = 0x3f800000;
                auVar148._28_4_ = 0x3f800000;
                auVar130 = vcvttps2dq_avx512vl(auVar129);
                auVar130 = vpslld_avx2(auVar130,0x17);
                auVar130 = vpaddd_avx2(auVar130,auVar180);
                auVar85 = vfmadd213ps_fma(auVar130,auVar148,auVar160);
                auVar130 = vdivps_avx(auVar160,ZEXT1632(auVar85));
                break;
              case 5:
                auVar130 = vminps_avx(auVar121,auVar151);
                auVar130 = vmaxps_avx(auVar130,auVar154);
                auVar85 = vfmadd213ps_fma(auVar158,auVar130,auVar156);
                auVar121 = vrndscaleps_avx512vl(ZEXT1632(auVar85),1);
                uVar80 = vcmpps_avx512vl(ZEXT1632(auVar85),auVar121,1);
                auVar122 = vsubps_avx512vl(auVar121,auVar160);
                bVar18 = (bool)((byte)uVar80 & 1);
                auVar123._0_4_ = (uint)bVar18 * auVar122._0_4_ | (uint)!bVar18 * auVar121._0_4_;
                bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar123._4_4_ = (uint)bVar18 * auVar122._4_4_ | (uint)!bVar18 * auVar121._4_4_;
                bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar123._8_4_ = (uint)bVar18 * auVar122._8_4_ | (uint)!bVar18 * auVar121._8_4_;
                bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar123._12_4_ = (uint)bVar18 * auVar122._12_4_ | (uint)!bVar18 * auVar121._12_4_;
                bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar123._16_4_ = (uint)bVar18 * auVar122._16_4_ | (uint)!bVar18 * auVar121._16_4_;
                bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar123._20_4_ = (uint)bVar18 * auVar122._20_4_ | (uint)!bVar18 * auVar121._20_4_;
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar123._24_4_ = (uint)bVar18 * auVar122._24_4_ | (uint)!bVar18 * auVar121._24_4_;
                bVar18 = SUB81(uVar80 >> 7,0);
                auVar123._28_4_ = (uint)bVar18 * auVar122._28_4_ | (uint)!bVar18 * auVar121._28_4_;
                auVar130 = vfmsub231ps_avx512vl(auVar130,auVar123,auVar162);
                auVar130 = vfnmsub231ps_avx512vl(auVar130,auVar123,auVar182);
                auVar169._0_4_ = auVar130._0_4_ * auVar130._0_4_;
                auVar169._4_4_ = auVar130._4_4_ * auVar130._4_4_;
                auVar169._8_4_ = auVar130._8_4_ * auVar130._8_4_;
                auVar169._12_4_ = auVar130._12_4_ * auVar130._12_4_;
                auVar169._16_4_ = auVar130._16_4_ * auVar130._16_4_;
                auVar169._20_4_ = auVar130._20_4_ * auVar130._20_4_;
                auVar169._24_4_ = auVar130._24_4_ * auVar130._24_4_;
                auVar169._28_4_ = 0;
                auVar121 = vfmadd213ps_avx512vl(auVar108,auVar130,auVar172);
                auVar121 = vfmadd213ps_avx512vl(auVar121,auVar130,auVar174);
                auVar121 = vfmadd213ps_avx512vl(auVar121,auVar130,auVar176);
                auVar121 = vfmadd213ps_avx512vl(auVar121,auVar130,auVar178);
                auVar121 = vfmadd213ps_avx512vl(auVar121,auVar130,auVar156);
                auVar130 = vfmadd213ps_avx512vl(auVar121,auVar169,auVar130);
                auVar121 = vaddps_avx512vl(auVar130,auVar160);
                auVar130 = vcvttps2dq_avx512vl(auVar123);
                auVar130 = vpslld_avx2(auVar130,0x17);
                auVar130 = vpaddd_avx2(auVar130,auVar180);
                auVar85 = vfmadd213ps_fma(auVar130,auVar121,auVar160);
                uVar80 = vcmpps_avx512vl(ZEXT1632(auVar85),auVar125,2);
                auVar121._8_4_ = 0x800000;
                auVar121._0_8_ = 0x80000000800000;
                auVar121._12_4_ = 0x800000;
                auVar121._16_4_ = 0x800000;
                auVar121._20_4_ = 0x800000;
                auVar121._24_4_ = 0x800000;
                auVar121._28_4_ = 0x800000;
                auVar130 = vmaxps_avx512vl(ZEXT1632(auVar85),auVar121);
                auVar122 = vpsrld_avx2(auVar130,0x17);
                auVar121 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                auVar125._8_4_ = 0x3f000000;
                auVar125._0_8_ = 0x3f0000003f000000;
                auVar125._12_4_ = 0x3f000000;
                auVar125._16_4_ = 0x3f000000;
                auVar125._20_4_ = 0x3f000000;
                auVar125._24_4_ = 0x3f000000;
                auVar125._28_4_ = 0x3f000000;
                auVar130 = vpternlogd_avx512vl(auVar130,auVar121,auVar125,0xea);
                uVar81 = vcmpps_avx512vl(auVar130,auVar109,1);
                auVar121 = vaddps_avx512vl(auVar130,auVar110);
                auVar130 = vaddps_avx512vl(auVar121,auVar130);
                bVar18 = (bool)((byte)uVar81 & 1);
                auVar124._0_4_ = (uint)bVar18 * auVar130._0_4_ | (uint)!bVar18 * auVar121._0_4_;
                bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar124._4_4_ = (uint)bVar18 * auVar130._4_4_ | (uint)!bVar18 * auVar121._4_4_;
                bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar124._8_4_ = (uint)bVar18 * auVar130._8_4_ | (uint)!bVar18 * auVar121._8_4_;
                bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar124._12_4_ = (uint)bVar18 * auVar130._12_4_ | (uint)!bVar18 * auVar121._12_4_;
                bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar124._16_4_ = (uint)bVar18 * auVar130._16_4_ | (uint)!bVar18 * auVar121._16_4_;
                bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar124._20_4_ = (uint)bVar18 * auVar130._20_4_ | (uint)!bVar18 * auVar121._20_4_;
                bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar124._24_4_ = (uint)bVar18 * auVar130._24_4_ | (uint)!bVar18 * auVar121._24_4_;
                bVar18 = SUB81(uVar81 >> 7,0);
                auVar124._28_4_ = (uint)bVar18 * auVar130._28_4_ | (uint)!bVar18 * auVar121._28_4_;
                auVar121 = vmulps_avx512vl(auVar124,auVar124);
                auVar130 = vfmadd213ps_avx512vl(auVar111,auVar124,auVar112);
                auVar130 = vfmadd213ps_avx512vl(auVar130,auVar124,auVar113);
                auVar130 = vfmadd213ps_avx512vl(auVar130,auVar124,auVar114);
                auVar130 = vfmadd213ps_avx512vl(auVar130,auVar124,auVar115);
                auVar130 = vfmadd213ps_avx512vl(auVar130,auVar124,auVar116);
                auVar130 = vfmadd213ps_avx512vl(auVar130,auVar124,auVar117);
                auVar130 = vfmadd213ps_avx512vl(auVar130,auVar124,auVar118);
                auVar130 = vfmadd213ps_avx512vl(auVar130,auVar124,auVar119);
                auVar125 = vmulps_avx512vl(auVar121,auVar124);
                auVar125 = vmulps_avx512vl(auVar125,auVar130);
                auVar27._8_4_ = 0xffffff82;
                auVar27._0_8_ = 0xffffff82ffffff82;
                auVar27._12_4_ = 0xffffff82;
                auVar27._16_4_ = 0xffffff82;
                auVar27._20_4_ = 0xffffff82;
                auVar27._24_4_ = 0xffffff82;
                auVar27._28_4_ = 0xffffff82;
                auVar130 = vpaddd_avx512vl(auVar122,auVar27);
                auVar130 = vcvtdq2ps_avx(auVar130);
                auVar122 = vsubps_avx512vl(auVar130,auVar160);
                bVar18 = (bool)((byte)uVar81 & 1);
                auVar126._0_4_ = (uint)bVar18 * auVar122._0_4_ | (uint)!bVar18 * auVar130._0_4_;
                bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar126._4_4_ = (uint)bVar18 * auVar122._4_4_ | (uint)!bVar18 * auVar130._4_4_;
                bVar18 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar126._8_4_ = (uint)bVar18 * auVar122._8_4_ | (uint)!bVar18 * auVar130._8_4_;
                bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar126._12_4_ = (uint)bVar18 * auVar122._12_4_ | (uint)!bVar18 * auVar130._12_4_;
                bVar18 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar126._16_4_ = (uint)bVar18 * auVar122._16_4_ | (uint)!bVar18 * auVar130._16_4_;
                bVar18 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar126._20_4_ = (uint)bVar18 * auVar122._20_4_ | (uint)!bVar18 * auVar130._20_4_;
                bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar126._24_4_ = (uint)bVar18 * auVar122._24_4_ | (uint)!bVar18 * auVar130._24_4_;
                bVar18 = SUB81(uVar81 >> 7,0);
                auVar126._28_4_ = (uint)bVar18 * auVar122._28_4_ | (uint)!bVar18 * auVar130._28_4_;
                auVar130 = vfmadd231ps_avx512vl(auVar125,auVar126,auVar182);
                auVar130 = vfmsub231ps_avx512vl(auVar130,auVar156,auVar121);
                auVar130 = vsubps_avx512vl(auVar130,auVar124);
                auVar85 = vfmsub231ps_fma(auVar130,auVar162,auVar126);
                auVar130 = vmulps_avx512vl(ZEXT1632(auVar85),auVar120);
                auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                bVar18 = (bool)((byte)uVar80 & 1);
                auVar127._0_4_ = (uint)bVar18 * auVar121._0_4_ | (uint)!bVar18 * auVar130._0_4_;
                bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar127._4_4_ = (uint)bVar18 * auVar121._4_4_ | (uint)!bVar18 * auVar130._4_4_;
                bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar127._8_4_ = (uint)bVar18 * auVar121._8_4_ | (uint)!bVar18 * auVar130._8_4_;
                bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar127._12_4_ = (uint)bVar18 * auVar121._12_4_ | (uint)!bVar18 * auVar130._12_4_;
                bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar127._16_4_ = (uint)bVar18 * auVar121._16_4_ | (uint)!bVar18 * auVar130._16_4_;
                bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar127._20_4_ = (uint)bVar18 * auVar121._20_4_ | (uint)!bVar18 * auVar130._20_4_;
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar127._24_4_ = (uint)bVar18 * auVar121._24_4_ | (uint)!bVar18 * auVar130._24_4_;
                bVar18 = SUB81(uVar80 >> 7,0);
                auVar127._28_4_ = (uint)bVar18 * auVar121._28_4_ | (uint)!bVar18 * auVar130._28_4_;
                auVar130 = vminps_avx(auVar127,auVar151);
                auVar130 = vmaxps_avx(auVar130,auVar154);
                auVar85 = vfmadd213ps_fma(auVar158,auVar130,auVar156);
                auVar121 = vrndscaleps_avx512vl(ZEXT1632(auVar85),1);
                uVar80 = vcmpps_avx512vl(ZEXT1632(auVar85),auVar121,1);
                auVar125 = vsubps_avx512vl(auVar121,auVar160);
                bVar18 = (bool)((byte)uVar80 & 1);
                auVar128._0_4_ = (uint)bVar18 * auVar125._0_4_ | (uint)!bVar18 * auVar121._0_4_;
                bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar128._4_4_ = (uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * auVar121._4_4_;
                bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar128._8_4_ = (uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * auVar121._8_4_;
                bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar128._12_4_ = (uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * auVar121._12_4_;
                bVar18 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar128._16_4_ = (uint)bVar18 * auVar125._16_4_ | (uint)!bVar18 * auVar121._16_4_;
                bVar18 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar128._20_4_ = (uint)bVar18 * auVar125._20_4_ | (uint)!bVar18 * auVar121._20_4_;
                bVar18 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar128._24_4_ = (uint)bVar18 * auVar125._24_4_ | (uint)!bVar18 * auVar121._24_4_;
                bVar18 = SUB81(uVar80 >> 7,0);
                auVar128._28_4_ = (uint)bVar18 * auVar125._28_4_ | (uint)!bVar18 * auVar121._28_4_;
                auVar130 = vfmsub231ps_avx512vl(auVar130,auVar128,auVar162);
                auVar130 = vfnmsub231ps_avx512vl(auVar130,auVar128,auVar182);
                auVar170._0_4_ = auVar130._0_4_ * auVar130._0_4_;
                auVar170._4_4_ = auVar130._4_4_ * auVar130._4_4_;
                auVar170._8_4_ = auVar130._8_4_ * auVar130._8_4_;
                auVar170._12_4_ = auVar130._12_4_ * auVar130._12_4_;
                auVar170._16_4_ = auVar130._16_4_ * auVar130._16_4_;
                auVar170._20_4_ = auVar130._20_4_ * auVar130._20_4_;
                auVar170._24_4_ = auVar130._24_4_ * auVar130._24_4_;
                auVar170._28_4_ = 0;
                auVar121 = vfmadd213ps_avx512vl(auVar108,auVar130,auVar172);
                auVar121 = vfmadd213ps_avx512vl(auVar121,auVar130,auVar174);
                auVar121 = vfmadd213ps_avx512vl(auVar121,auVar130,auVar176);
                auVar121 = vfmadd213ps_avx512vl(auVar121,auVar130,auVar178);
                auVar121 = vfmadd213ps_avx512vl(auVar121,auVar130,auVar156);
                auVar130 = vfmadd213ps_avx512vl(auVar121,auVar170,auVar130);
                auVar121 = vaddps_avx512vl(auVar130,auVar160);
                auVar130 = vcvttps2dq_avx512vl(auVar128);
                auVar130 = vpslld_avx2(auVar130,0x17);
                auVar130 = vpaddd_avx2(auVar130,auVar180);
                auVar85 = vfmadd213ps_fma(auVar130,auVar121,auVar160);
                auVar130 = vdivps_avx(auVar160,ZEXT1632(auVar85));
                auVar121 = vfnmadd213ps_avx512vl(auVar130,auVar120,auVar110);
                goto LAB_003e923e;
              case 6:
                puVar15 = (undefined4 *)(this->super_DeconvolutionDepthWise).activation_params.data;
                uVar1 = *puVar15;
                auVar165._4_4_ = uVar1;
                auVar165._0_4_ = uVar1;
                auVar165._8_4_ = uVar1;
                auVar165._12_4_ = uVar1;
                auVar165._16_4_ = uVar1;
                auVar165._20_4_ = uVar1;
                auVar165._24_4_ = uVar1;
                auVar165._28_4_ = uVar1;
                uVar1 = puVar15[1];
                auVar122._4_4_ = uVar1;
                auVar122._0_4_ = uVar1;
                auVar122._8_4_ = uVar1;
                auVar122._12_4_ = uVar1;
                auVar122._16_4_ = uVar1;
                auVar122._20_4_ = uVar1;
                auVar122._24_4_ = uVar1;
                auVar122._28_4_ = uVar1;
                auVar130 = vfmadd213ps_avx512vl(auVar165,auVar121,auVar122);
                auVar130 = vmaxps_avx(auVar130,auVar125);
                auVar121 = vminps_avx(auVar130,auVar160);
LAB_003e923e:
                auVar130._4_4_ = auVar121._4_4_ * auVar149._4_4_;
                auVar130._0_4_ = auVar121._0_4_ * auVar149._0_4_;
                auVar130._8_4_ = auVar121._8_4_ * auVar149._8_4_;
                auVar130._12_4_ = auVar121._12_4_ * auVar149._12_4_;
                auVar130._16_4_ = auVar121._16_4_ * auVar149._16_4_;
                auVar130._20_4_ = auVar121._20_4_ * auVar149._20_4_;
                auVar130._24_4_ = auVar121._24_4_ * auVar149._24_4_;
                auVar130._28_4_ = auVar121._28_4_;
              }
switchD_003e8f9c_caseD_1:
              *pauVar74 = auVar130;
              pauVar74 = pauVar74 + 1;
              iVar2 = iVar2 + 1;
            }
          }
          iVar57 = iVar57 + iVar55 * 8;
        }
      }
      else if (iVar57 == 4) {
        if (iVar71 < 1) {
          iVar71 = 0;
        }
        if (iVar76 < 1) {
          iVar76 = 0;
        }
        local_1c8 = 0;
        if (0 < (int)uVar56) {
          local_1c8 = uVar83;
        }
        local_1d0 = CONCAT44(local_1d0._4_4_,iVar55 * 4);
        auVar150._8_4_ = 0x42b0c0a5;
        auVar150._0_8_ = 0x42b0c0a542b0c0a5;
        auVar150._12_4_ = 0x42b0c0a5;
        auVar153._8_4_ = 0xc2b0c0a5;
        auVar153._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar153._12_4_ = 0xc2b0c0a5;
        auVar155._8_4_ = 0x3f000000;
        auVar155._0_8_ = 0x3f0000003f000000;
        auVar155._12_4_ = 0x3f000000;
        auVar157._8_4_ = 0x3fb8aa3b;
        auVar157._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar157._12_4_ = 0x3fb8aa3b;
        auVar159._8_4_ = 0x3f800000;
        auVar159._0_8_ = 0x3f8000003f800000;
        auVar159._12_4_ = 0x3f800000;
        auVar161._8_4_ = 0x3f318000;
        auVar161._0_8_ = 0x3f3180003f318000;
        auVar161._12_4_ = 0x3f318000;
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar171._8_4_ = 0x3ab743ce;
        auVar171._0_8_ = 0x3ab743ce3ab743ce;
        auVar171._12_4_ = 0x3ab743ce;
        auVar173._8_4_ = 0x3c088908;
        auVar173._0_8_ = 0x3c0889083c088908;
        auVar173._12_4_ = 0x3c088908;
        auVar175._8_4_ = 0x3d2aa9c1;
        auVar175._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar175._12_4_ = 0x3d2aa9c1;
        auVar177._8_4_ = 0x3e2aaaaa;
        auVar177._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar177._12_4_ = 0x3e2aaaaa;
        auVar179._8_4_ = 0x3f800000;
        auVar179._0_8_ = 0x3f8000003f800000;
        auVar179._12_4_ = 0x3f800000;
        auVar181._8_4_ = 0xb95e8083;
        auVar181._0_8_ = 0xb95e8083b95e8083;
        auVar181._12_4_ = 0xb95e8083;
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        iVar57 = 0;
        for (uVar68 = 0; uVar68 != local_1c8; uVar68 = uVar68 + 1) {
          pauVar75 = (undefined1 (*) [16])
                     (local_218.cstep * uVar68 * local_218.elemsize + (long)local_218.data);
          iVar67 = bottom_blob->w;
          sVar78 = bottom_blob->cstep;
          sVar12 = bottom_blob->elemsize;
          pvVar13 = bottom_blob->data;
          pvVar14 = (this->weight_data_tm).data;
          for (iVar61 = 0; iVar61 != iVar76; iVar61 = iVar61 + 1) {
            iVar2 = -iVar82;
            for (iVar66 = 0; iVar66 != iVar71; iVar66 = iVar66 + 1) {
              if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
                auVar107 = ZEXT816(0) << 0x40;
              }
              else {
                auVar107 = *(undefined1 (*) [16])
                            ((long)(this->super_DeconvolutionDepthWise).bias_data.data +
                            uVar68 * 0x10);
              }
              auVar149 = ZEXT1664(auVar107);
              iVar63 = (this->super_DeconvolutionDepthWise).stride_h;
              uVar79 = (this->super_DeconvolutionDepthWise).kernel_w;
              uVar56 = (this->super_DeconvolutionDepthWise).kernel_h;
              uVar80 = 0;
              if (0 < (int)uVar79) {
                uVar80 = (ulong)uVar79;
              }
              iVar9 = (this->super_DeconvolutionDepthWise).stride_w;
              if ((int)uVar56 < 1) {
                uVar56 = 0;
              }
              pvVar72 = (void *)((long)iVar57 * 4 + (long)pvVar14);
              for (uVar83 = 0; uVar83 != uVar56; uVar83 = uVar83 + 1) {
                iVar58 = (this->super_DeconvolutionDepthWise).dilation_h * (int)uVar83 +
                         (iVar61 - iVar65);
                if ((-1 < iVar58) &&
                   (iVar59 = iVar58 / iVar63, iVar59 < iVar69 && iVar58 % iVar63 == 0)) {
                  iVar58 = iVar2;
                  for (lVar77 = 0; uVar80 * 0x10 != lVar77; lVar77 = lVar77 + 0x10) {
                    if ((-1 < iVar58) &&
                       (iVar60 = iVar58 / iVar9, iVar60 < iVar64 && iVar58 % iVar9 == 0)) {
                      auVar107 = vfmadd231ps_fma(auVar149._0_16_,
                                                 *(undefined1 (*) [16])
                                                  ((long)pvVar13 +
                                                  (long)(iVar60 << 2) * 4 +
                                                  (long)iVar59 * (long)iVar67 * sVar12 +
                                                  sVar78 * uVar68 * sVar12),
                                                 *(undefined1 (*) [16])((long)pvVar72 + lVar77));
                      auVar149 = ZEXT1664(auVar107);
                    }
                    iVar58 = iVar58 + (this->super_DeconvolutionDepthWise).dilation_w;
                  }
                }
                pvVar72 = (void *)((long)pvVar72 + (long)(int)uVar79 * 0x10);
              }
              iVar63 = (this->super_DeconvolutionDepthWise).activation_type;
              auVar105 = auVar149._0_16_;
              auVar107 = auVar105;
              if (iVar63 - 1U < 6) {
                auVar107 = vmaxps_avx(auVar105,(undefined1  [16])0x0);
                switch(iVar63) {
                case 2:
                  auVar105 = vminps_avx(auVar105,(undefined1  [16])0x0);
                  uVar1 = *(this->super_DeconvolutionDepthWise).activation_params.data;
                  auVar26._4_4_ = uVar1;
                  auVar26._0_4_ = uVar1;
                  auVar26._8_4_ = uVar1;
                  auVar26._12_4_ = uVar1;
                  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar26);
                  break;
                case 3:
                  puVar15 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar15;
                  auVar24._4_4_ = uVar1;
                  auVar24._0_4_ = uVar1;
                  auVar24._8_4_ = uVar1;
                  auVar24._12_4_ = uVar1;
                  auVar107 = vmaxps_avx512vl(auVar105,auVar24);
                  uVar1 = puVar15[1];
                  auVar25._4_4_ = uVar1;
                  auVar25._0_4_ = uVar1;
                  auVar25._8_4_ = uVar1;
                  auVar25._12_4_ = uVar1;
                  auVar107 = vminps_avx512vl(auVar107,auVar25);
                  break;
                case 4:
                  auVar23._8_4_ = 0x80000000;
                  auVar23._0_8_ = 0x8000000080000000;
                  auVar23._12_4_ = 0x80000000;
                  auVar107 = vxorps_avx512vl(auVar105,auVar23);
                  auVar107 = vminps_avx(auVar107,auVar150);
                  auVar107 = vmaxps_avx(auVar107,auVar153);
                  auVar105 = vfmadd231ps_fma(auVar155,auVar107,auVar157);
                  auVar99 = vcvttps2dq_avx512vl(auVar105);
                  auVar99 = vcvtdq2ps_avx512vl(auVar99);
                  uVar80 = vcmpps_avx512vl(auVar105,auVar99,1);
                  auVar105 = vsubps_avx512vl(auVar99,auVar159);
                  bVar18 = (bool)((byte)uVar80 & 1);
                  auVar106._0_4_ = (uint)bVar18 * auVar105._0_4_ | (uint)!bVar18 * auVar99._0_4_;
                  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                  auVar106._4_4_ = (uint)bVar18 * auVar105._4_4_ | (uint)!bVar18 * auVar99._4_4_;
                  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                  auVar106._8_4_ = (uint)bVar18 * auVar105._8_4_ | (uint)!bVar18 * auVar99._8_4_;
                  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                  auVar106._12_4_ = (uint)bVar18 * auVar105._12_4_ | (uint)!bVar18 * auVar99._12_4_;
                  auVar107 = vfmsub231ps_avx512vl(auVar107,auVar106,auVar161);
                  auVar105._8_4_ = 0x395e8083;
                  auVar105._0_8_ = 0x395e8083395e8083;
                  auVar105._12_4_ = 0x395e8083;
                  auVar105 = vfmsub231ps_avx512vl(auVar107,auVar106,auVar105);
                  auVar163._0_4_ = auVar105._0_4_ * auVar105._0_4_;
                  auVar163._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                  auVar163._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                  auVar163._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                  auVar107 = vfmadd213ps_fma(auVar85,auVar105,auVar171);
                  auVar107 = vfmadd213ps_fma(auVar107,auVar105,auVar173);
                  auVar107 = vfmadd213ps_fma(auVar107,auVar105,auVar175);
                  auVar107 = vfmadd213ps_fma(auVar107,auVar105,auVar177);
                  auVar107 = vfmadd213ps_fma(auVar107,auVar105,auVar155);
                  auVar107 = vfmadd213ps_fma(auVar107,auVar163,auVar105);
                  auVar147._0_4_ = auVar107._0_4_ + 1.0;
                  auVar147._4_4_ = auVar107._4_4_ + 1.0;
                  auVar147._8_4_ = auVar107._8_4_ + 1.0;
                  auVar147._12_4_ = auVar107._12_4_ + 1.0;
                  auVar107 = vcvttps2dq_avx512vl(auVar106);
                  auVar107 = vpslld_avx(auVar107,0x17);
                  auVar107 = vpaddd_avx(auVar107,auVar179);
                  auVar107 = vfmadd213ps_fma(auVar107,auVar147,auVar159);
                  auVar107 = vdivps_avx(auVar159,auVar107);
                  break;
                case 5:
                  auVar107 = vminps_avx(auVar105,auVar150);
                  auVar107 = vmaxps_avx(auVar107,auVar153);
                  auVar99 = vfmadd213ps_fma(auVar157,auVar107,auVar155);
                  auVar98 = vcvttps2dq_avx512vl(auVar99);
                  auVar98 = vcvtdq2ps_avx512vl(auVar98);
                  uVar80 = vcmpps_avx512vl(auVar99,auVar98,1);
                  auVar99 = vsubps_avx512vl(auVar98,auVar159);
                  bVar18 = (bool)((byte)uVar80 & 1);
                  auVar100._0_4_ = (uint)bVar18 * auVar99._0_4_ | (uint)!bVar18 * auVar98._0_4_;
                  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                  auVar100._4_4_ = (uint)bVar18 * auVar99._4_4_ | (uint)!bVar18 * auVar98._4_4_;
                  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                  auVar100._8_4_ = (uint)bVar18 * auVar99._8_4_ | (uint)!bVar18 * auVar98._8_4_;
                  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                  auVar100._12_4_ = (uint)bVar18 * auVar99._12_4_ | (uint)!bVar18 * auVar98._12_4_;
                  auVar107 = vfmsub231ps_avx512vl(auVar107,auVar100,auVar161);
                  auVar107 = vfnmsub231ps_avx512vl(auVar107,auVar100,auVar181);
                  auVar166._0_4_ = auVar107._0_4_ * auVar107._0_4_;
                  auVar166._4_4_ = auVar107._4_4_ * auVar107._4_4_;
                  auVar166._8_4_ = auVar107._8_4_ * auVar107._8_4_;
                  auVar166._12_4_ = auVar107._12_4_ * auVar107._12_4_;
                  auVar99 = vfmadd213ps_avx512vl(auVar85,auVar107,auVar171);
                  auVar99 = vfmadd213ps_avx512vl(auVar99,auVar107,auVar173);
                  auVar99 = vfmadd213ps_avx512vl(auVar99,auVar107,auVar175);
                  auVar99 = vfmadd213ps_avx512vl(auVar99,auVar107,auVar177);
                  auVar99 = vfmadd213ps_avx512vl(auVar99,auVar107,auVar155);
                  auVar107 = vfmadd213ps_avx512vl(auVar99,auVar166,auVar107);
                  auVar99 = vaddps_avx512vl(auVar107,auVar159);
                  auVar107 = vcvttps2dq_avx512vl(auVar100);
                  auVar107 = vpslld_avx(auVar107,0x17);
                  auVar107 = vpaddd_avx(auVar107,auVar179);
                  auVar107 = vfmadd213ps_fma(auVar107,auVar99,auVar159);
                  uVar80 = vcmpps_avx512vl(auVar107,(undefined1  [16])0x0,2);
                  auVar167._8_4_ = 0x800000;
                  auVar167._0_8_ = 0x80000000800000;
                  auVar167._12_4_ = 0x800000;
                  auVar107 = vmaxps_avx512vl(auVar107,auVar167);
                  auVar167 = vpsrld_avx(auVar107,0x17);
                  auVar99 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar21._8_4_ = 0x3f000000;
                  auVar21._0_8_ = 0x3f0000003f000000;
                  auVar21._12_4_ = 0x3f000000;
                  auVar107 = vpternlogd_avx512vl(auVar107,auVar99,auVar21,0xea);
                  uVar83 = vcmpps_avx512vl(auVar107,auVar86,1);
                  auVar99 = vaddps_avx512vl(auVar107,auVar87);
                  auVar107 = vaddps_avx512vl(auVar99,auVar107);
                  bVar18 = (bool)((byte)uVar83 & 1);
                  auVar101._0_4_ = (uint)bVar18 * auVar107._0_4_ | (uint)!bVar18 * auVar99._0_4_;
                  bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
                  auVar101._4_4_ = (uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar99._4_4_;
                  bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                  auVar101._8_4_ = (uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar99._8_4_;
                  bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
                  auVar101._12_4_ = (uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar99._12_4_;
                  auVar99 = vmulps_avx512vl(auVar101,auVar101);
                  auVar107 = vfmadd213ps_avx512vl(auVar88,auVar101,auVar89);
                  auVar107 = vfmadd213ps_avx512vl(auVar107,auVar101,auVar90);
                  auVar107 = vfmadd213ps_avx512vl(auVar107,auVar101,auVar91);
                  auVar107 = vfmadd213ps_avx512vl(auVar107,auVar101,auVar92);
                  auVar107 = vfmadd213ps_avx512vl(auVar107,auVar101,auVar93);
                  auVar107 = vfmadd213ps_avx512vl(auVar107,auVar101,auVar94);
                  auVar107 = vfmadd213ps_avx512vl(auVar107,auVar101,auVar95);
                  auVar107 = vfmadd213ps_avx512vl(auVar107,auVar101,auVar96);
                  auVar98 = vmulps_avx512vl(auVar99,auVar101);
                  auVar98 = vmulps_avx512vl(auVar98,auVar107);
                  auVar22._8_4_ = 0xffffff82;
                  auVar22._0_8_ = 0xffffff82ffffff82;
                  auVar22._12_4_ = 0xffffff82;
                  auVar107 = vpaddd_avx512vl(auVar167,auVar22);
                  auVar107 = vcvtdq2ps_avx(auVar107);
                  auVar167 = vsubps_avx512vl(auVar107,auVar159);
                  bVar18 = (bool)((byte)uVar83 & 1);
                  auVar102._0_4_ = (uint)bVar18 * auVar167._0_4_ | (uint)!bVar18 * auVar107._0_4_;
                  bVar18 = (bool)((byte)(uVar83 >> 1) & 1);
                  auVar102._4_4_ = (uint)bVar18 * auVar167._4_4_ | (uint)!bVar18 * auVar107._4_4_;
                  bVar18 = (bool)((byte)(uVar83 >> 2) & 1);
                  auVar102._8_4_ = (uint)bVar18 * auVar167._8_4_ | (uint)!bVar18 * auVar107._8_4_;
                  bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
                  auVar102._12_4_ = (uint)bVar18 * auVar167._12_4_ | (uint)!bVar18 * auVar107._12_4_
                  ;
                  auVar107 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar181);
                  auVar107 = vfmsub231ps_avx512vl(auVar107,auVar155,auVar99);
                  auVar107 = vsubps_avx512vl(auVar107,auVar101);
                  auVar107 = vfnmadd231ps_fma(auVar107,auVar161,auVar102);
                  auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar18 = (bool)((byte)uVar80 & 1);
                  auVar103._0_4_ =
                       (uint)bVar18 * auVar99._0_4_ |
                       (uint)!bVar18 * (int)(auVar107._0_4_ + auVar107._0_4_);
                  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                  auVar103._4_4_ =
                       (uint)bVar18 * auVar99._4_4_ |
                       (uint)!bVar18 * (int)(auVar107._4_4_ + auVar107._4_4_);
                  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                  auVar103._8_4_ =
                       (uint)bVar18 * auVar99._8_4_ |
                       (uint)!bVar18 * (int)(auVar107._8_4_ + auVar107._8_4_);
                  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                  auVar103._12_4_ =
                       (uint)bVar18 * auVar99._12_4_ |
                       (uint)!bVar18 * (int)(auVar107._12_4_ + auVar107._12_4_);
                  auVar107 = vminps_avx(auVar103,auVar150);
                  auVar107 = vmaxps_avx(auVar107,auVar153);
                  auVar99 = vfmadd213ps_fma(auVar157,auVar107,auVar155);
                  auVar98 = vcvttps2dq_avx512vl(auVar99);
                  auVar98 = vcvtdq2ps_avx512vl(auVar98);
                  uVar80 = vcmpps_avx512vl(auVar99,auVar98,1);
                  auVar99 = vsubps_avx512vl(auVar98,auVar159);
                  bVar18 = (bool)((byte)uVar80 & 1);
                  auVar104._0_4_ = (uint)bVar18 * auVar99._0_4_ | (uint)!bVar18 * auVar98._0_4_;
                  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
                  auVar104._4_4_ = (uint)bVar18 * auVar99._4_4_ | (uint)!bVar18 * auVar98._4_4_;
                  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
                  auVar104._8_4_ = (uint)bVar18 * auVar99._8_4_ | (uint)!bVar18 * auVar98._8_4_;
                  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
                  auVar104._12_4_ = (uint)bVar18 * auVar99._12_4_ | (uint)!bVar18 * auVar98._12_4_;
                  auVar107 = vfmsub231ps_avx512vl(auVar107,auVar104,auVar161);
                  auVar107 = vfnmsub231ps_avx512vl(auVar107,auVar104,auVar181);
                  auVar168._0_4_ = auVar107._0_4_ * auVar107._0_4_;
                  auVar168._4_4_ = auVar107._4_4_ * auVar107._4_4_;
                  auVar168._8_4_ = auVar107._8_4_ * auVar107._8_4_;
                  auVar168._12_4_ = auVar107._12_4_ * auVar107._12_4_;
                  auVar99 = vfmadd213ps_avx512vl(auVar85,auVar107,auVar171);
                  auVar99 = vfmadd213ps_avx512vl(auVar99,auVar107,auVar173);
                  auVar99 = vfmadd213ps_avx512vl(auVar99,auVar107,auVar175);
                  auVar99 = vfmadd213ps_avx512vl(auVar99,auVar107,auVar177);
                  auVar99 = vfmadd213ps_avx512vl(auVar99,auVar107,auVar155);
                  auVar107 = vfmadd213ps_avx512vl(auVar99,auVar168,auVar107);
                  auVar99 = vaddps_avx512vl(auVar107,auVar159);
                  auVar107 = vcvttps2dq_avx512vl(auVar104);
                  auVar107 = vpslld_avx(auVar107,0x17);
                  auVar107 = vpaddd_avx(auVar107,auVar179);
                  auVar107 = vfmadd213ps_fma(auVar107,auVar99,auVar159);
                  auVar107 = vdivps_avx512vl(auVar97,auVar107);
                  auVar107 = vfmsub213ps_fma(auVar107,auVar105,auVar105);
                  break;
                case 6:
                  puVar15 = (undefined4 *)
                            (this->super_DeconvolutionDepthWise).activation_params.data;
                  uVar1 = *puVar15;
                  auVar98._4_4_ = uVar1;
                  auVar98._0_4_ = uVar1;
                  auVar98._8_4_ = uVar1;
                  auVar98._12_4_ = uVar1;
                  uVar1 = puVar15[1];
                  auVar99._4_4_ = uVar1;
                  auVar99._0_4_ = uVar1;
                  auVar99._8_4_ = uVar1;
                  auVar99._12_4_ = uVar1;
                  auVar107 = vfmadd213ps_avx512vl(auVar98,auVar105,auVar99);
                  auVar107 = vmaxps_avx(auVar107,(undefined1  [16])0x0);
                  auVar105 = vminps_avx(auVar107,auVar159);
                  auVar107._0_4_ = auVar105._0_4_ * auVar149._0_4_;
                  auVar107._4_4_ = auVar105._4_4_ * auVar149._4_4_;
                  auVar107._8_4_ = auVar105._8_4_ * auVar149._8_4_;
                  auVar107._12_4_ = auVar105._12_4_ * auVar149._12_4_;
                }
              }
              *pauVar75 = auVar107;
              pauVar75 = pauVar75 + 1;
              iVar2 = iVar2 + 1;
            }
          }
          iVar57 = iVar57 + iVar55 * 4;
        }
      }
    }
    else {
      uVar68 = (long)(int)(iVar57 * uVar56) / (long)iVar67;
      uVar80 = (long)iVar55 / (long)iVar67;
      if (opt->use_packing_layout == true) {
        _elempack = 0x10;
        uVar56 = _elempack;
        if ((uVar68 & 0xf) != 0) {
          if ((uVar68 & 7) == 0) {
            uVar56 = 8;
          }
          else {
            uVar56 = (uint)((uVar68 & 3) == 0) * 3 + 1;
          }
        }
        if ((uVar80 & 0xf) != 0) {
          if ((uVar80 & 7) == 0) {
            _elempack = 8;
          }
          else {
            _elempack = (uint)((uVar80 & 3) == 0) * 3 + 1;
          }
        }
      }
      else {
        _elempack = 1;
        uVar56 = 1;
      }
      piVar10 = bottom_blob->refcount;
      local_168.data = bottom_blob->data;
      local_168.refcount = bottom_blob->refcount;
      local_168.elemsize = bottom_blob->elemsize;
      local_168.elempack = bottom_blob->elempack;
      local_168.allocator = bottom_blob->allocator;
      local_168.dims = bottom_blob->dims;
      local_168.w = bottom_blob->w;
      local_168.h = bottom_blob->h;
      local_168.d = bottom_blob->d;
      local_168.c = bottom_blob->c;
      local_168.cstep = bottom_blob->cstep;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      local_278 = uVar80 & 0xffffffff;
      uVar83 = local_278;
      if ((int)uVar56 < iVar57) {
        auVar149 = vmovdqu64_avx512f((undefined1  [64])*opt);
        auVar149 = vmovdqu64_avx512f(auVar149);
        opt_p._16_48_ = auVar149._16_48_;
        opt_p._0_8_ = auVar149._0_8_;
        opt_p.blob_allocator = opt->workspace_allocator;
        convert_packing(bottom_blob,&local_168,uVar56,&opt_p);
        if (local_168.data == (void *)0x0) {
          iVar64 = -100;
          bVar18 = false;
        }
        else {
          if ((long)local_168.c * local_168.cstep != 0) goto LAB_003e9dd5;
          bVar18 = false;
          iVar64 = -100;
        }
      }
      else {
LAB_003e9dd5:
        auVar54 = (undefined1  [36])opt_p._28_36_;
        sVar12 = local_218.cstep;
        piVar10 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
        opt_p.blob_allocator._4_4_ = local_218.refcount._4_4_;
        opt_p.blob_allocator._0_4_ = local_218.refcount._0_4_;
        opt_p._0_8_ = local_218.data;
        opt_p.workspace_allocator = (Allocator *)local_218.elemsize;
        opt_p.openmp_blocktime = local_218.elempack;
        opt_p._32_8_ = local_218.allocator;
        opt_p.use_reserved_1 = (bool)(undefined1)local_218.w;
        opt_p.use_image_storage = (bool)local_218.w._1_1_;
        opt_p.use_tensor_storage = (bool)local_218.w._2_1_;
        opt_p.use_reserved_2 = (bool)local_218.w._3_1_;
        opt_p.vulkan_device_index = local_218.dims;
        opt_p._48_8_ = local_218._48_8_;
        opt_p._60_4_ = auVar54._32_4_;
        opt_p.use_winograd43_convolution = (bool)(undefined1)local_218.c;
        opt_p.use_winograd63_convolution = (bool)local_218.c._1_1_;
        opt_p.use_a53_a55_optimized_kernel = (bool)local_218.c._2_1_;
        opt_p.use_fp16_uniform = (bool)local_218.c._3_1_;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
        if (_elempack < uVar79) {
          Mat::create((Mat *)&opt_p,iVar71,iVar76,
                      (this->super_DeconvolutionDepthWise).num_output / (int)_elempack,
                      (ulong)_elempack * (sVar78 / uVar79),_elempack,opt->workspace_allocator);
          if ((opt_p._0_8_ != 0) && ((long)(int)opt_p._56_4_ * sVar12 != 0)) goto LAB_003e9ed6;
LAB_003ea1bf:
          iVar64 = -100;
          bVar18 = false;
        }
        else {
LAB_003e9ed6:
          iVar57 = 0;
          iVar69 = 0;
          lVar77 = 0;
          uVar81 = uVar80;
          do {
            if ((this->super_DeconvolutionDepthWise).group <= lVar77) {
              if (_elempack < uVar79) {
                convert_packing((Mat *)&opt_p,&local_218,uVar79,opt);
                if ((local_218.data == (void *)0x0) || ((long)local_218.c * local_218.cstep == 0))
                goto LAB_003ea1bf;
              }
              else {
                if (opt_p.blob_allocator != (Allocator *)0x0) {
                  LOCK();
                  *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
                       *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
                  UNLOCK();
                }
                piVar10 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (*piVar10 == 0) {
                    if (local_218.allocator == (Allocator *)0x0) {
                      free(local_218.data);
                    }
                    else {
                      (*(local_218.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                OVar53 = opt_p;
                local_218.data = (void *)opt_p._0_8_;
                local_218.refcount._0_4_ = opt_p.blob_allocator._0_4_;
                local_218.refcount._4_4_ = opt_p.blob_allocator._4_4_;
                local_218.elemsize = (size_t)opt_p.workspace_allocator;
                local_218.elempack = opt_p.openmp_blocktime;
                local_218.allocator = (Allocator *)opt_p._32_8_;
                local_218.dims = opt_p.vulkan_device_index;
                local_218.w = opt_p._44_4_;
                local_218._48_8_ = opt_p._48_8_;
                local_218.c._0_1_ = opt_p.use_winograd43_convolution;
                local_218.c._1_1_ = opt_p.use_winograd63_convolution;
                local_218.c._2_1_ = opt_p.use_a53_a55_optimized_kernel;
                local_218.c._3_1_ = opt_p.use_fp16_uniform;
                local_218.cstep = sVar12;
                opt_p = OVar53;
              }
              iVar64 = -100;
              bVar18 = true;
              goto LAB_003ea2a0;
            }
            m.c = (int)uVar68 / (int)uVar56;
            m.data = (void *)((long)(iVar57 / (int)uVar56) * local_168.cstep * local_168.elemsize +
                             (long)local_168.data);
            m.refcount = (int *)0x0;
            m.elemsize = local_168.elemsize;
            m.elempack = local_168.elempack;
            m.allocator = local_168.allocator;
            m.cstep = ((long)local_168.d * local_168.elemsize *
                       (long)local_168.h * (long)local_168.w + 0xf & 0xfffffffffffffff0) /
                      local_168.elemsize;
            m.dims = local_168.dims;
            m.w = local_168.w;
            m.h = local_168.h;
            m.d = local_168.d;
            m_1.c = (int)uVar81 / (int)_elempack;
            m_1.data = (void *)((long)(iVar69 / (int)_elempack) * sVar12 *
                                (long)opt_p.workspace_allocator + opt_p._0_8_);
            m_1.refcount = (int *)0x0;
            m_1.elemsize = (size_t)opt_p.workspace_allocator;
            m_1.elempack = opt_p.openmp_blocktime;
            m_1.allocator = (Allocator *)opt_p._32_8_;
            m_1._40_8_ = opt_p._40_8_;
            m_1._48_8_ = opt_p._48_8_;
            m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                         (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                        0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
            pLVar17 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar77];
            auVar149 = vmovdqu64_avx512f((undefined1  [64])*opt);
            auVar149 = vmovdqu64_avx512f(auVar149);
            opt_g._16_48_ = auVar149._16_48_;
            opt_g._0_8_ = auVar149._0_8_;
            opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
            iVar64 = (*pLVar17->_vptr_Layer[7])(pLVar17,&m,&m_1,&opt_g);
            local_278._0_4_ = (int)uVar80;
            if (m_1.refcount != (int *)0x0) {
              LOCK();
              *m_1.refcount = *m_1.refcount + -1;
              UNLOCK();
              if (*m_1.refcount == 0) {
                if (m_1.allocator == (Allocator *)0x0) {
                  free(m_1.data);
                }
                else {
                  (*(m_1.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (m.refcount != (int *)0x0) {
              LOCK();
              *m.refcount = *m.refcount + -1;
              UNLOCK();
              if (*m.refcount == 0) {
                if (m.allocator == (Allocator *)0x0) {
                  free(m.data);
                }
                else {
                  (*(m.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            lVar77 = lVar77 + 1;
            iVar69 = iVar69 + (int)local_278;
            iVar57 = iVar57 + (int)uVar68;
            uVar81 = uVar83;
          } while (iVar64 == 0);
          bVar18 = false;
        }
LAB_003ea2a0:
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_p._32_8_ == 0) {
              free((void *)opt_p._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
            }
          }
        }
      }
      if (local_168.refcount != (int *)0x0) {
        LOCK();
        *local_168.refcount = *local_168.refcount + -1;
        UNLOCK();
        if (*local_168.refcount == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar18) goto LAB_003ea35a;
    }
    pMVar52 = local_1c0;
    DeconvolutionDepthWise::cut_padding
              (&this->super_DeconvolutionDepthWise,&local_218,local_1c0,opt);
    if ((pMVar52->data != (void *)0x0) && (iVar64 = 0, (long)local_1c0->c * local_1c0->cstep != 0))
    goto LAB_003ea35a;
  }
  iVar64 = -100;
LAB_003ea35a:
  piVar10 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        free(local_218.data);
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar64;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
            if (bottom_blob_unpacked.empty())
                return -100;
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            int ret = op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
            if (ret != 0)
                return ret;
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
            if (top_blob_bordered.empty())
                return -100;
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}